

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *psVar1;
  uint64_t *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined8 uVar1122;
  undefined8 uVar1123;
  undefined8 uVar1124;
  bool bVar1125;
  uint uVar1126;
  int iVar1127;
  ulong uVar1128;
  ulong uVar1129;
  uint64_t uVar1130;
  ulong uVar1131;
  ulong uVar1132;
  secp256k1_ge *psVar1133;
  long lVar1134;
  ulong uVar1135;
  ulong uVar1136;
  uint64_t uVar1137;
  ulong uVar1138;
  ulong uVar1139;
  ulong uVar1140;
  ulong uVar1141;
  uint64_t uVar1142;
  secp256k1_fe *psVar1143;
  undefined8 *puVar1144;
  secp256k1_gej *psVar1145;
  secp256k1_ge *psVar1146;
  ulong uVar1147;
  ulong uVar1148;
  uint64_t uVar1149;
  ulong uVar1150;
  ulong uVar1151;
  ulong uVar1152;
  ulong uVar1153;
  ulong uVar1154;
  ulong uVar1155;
  ulong uVar1156;
  ulong uVar1157;
  ulong uVar1158;
  ulong uVar1159;
  ulong uVar1160;
  ulong uVar1161;
  uint64_t uVar1162;
  ulong uVar1163;
  ulong *puVar1164;
  long lVar1165;
  undefined8 *puVar1166;
  byte bVar1167;
  uint64_t tmp3_6;
  uint64_t tmp2;
  uint64_t tmp2_15;
  secp256k1_fe s1;
  secp256k1_fe h3;
  secp256k1_fe i;
  secp256k1_ge tmpa;
  secp256k1_fe t;
  uint64_t tmp3;
  secp256k1_fe h;
  secp256k1_fe Z;
  uint64_t tmp1;
  secp256k1_fe i2;
  secp256k1_fe s2;
  uint64_t tmp2_1;
  secp256k1_fe h2;
  secp256k1_fe zr [8];
  int wnaf_ng [256];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  secp256k1_strauss_point_state ps [1];
  long local_1320;
  uint local_1308;
  secp256k1_fe local_1278;
  ulong local_1250;
  secp256k1_ge local_1248;
  ulong local_11f0;
  ulong uStack_11e8;
  ulong local_11e0;
  ulong uStack_11d8;
  uint64_t local_11d0;
  ulong local_11c8;
  ulong local_11c0;
  ulong local_11b8;
  ulong local_11b0;
  long local_11a8;
  secp256k1_fe local_11a0;
  ulong local_1178;
  ulong uStack_1170;
  ulong local_1168;
  ulong uStack_1160;
  ulong local_1158;
  secp256k1_scalar *local_1150;
  secp256k1_ecmult_context *local_1148;
  ulong local_1140;
  ulong local_1138;
  ulong local_1130;
  ulong local_1128;
  ulong local_1120;
  ulong local_1118;
  ulong local_1110;
  ulong local_1108;
  ulong local_1100;
  long local_10f8;
  ulong local_10f0;
  ulong local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  long local_10d0;
  secp256k1_ge local_10c8;
  ulong local_1070;
  ulong local_1068;
  ulong local_1060;
  ulong local_1058;
  ulong local_1050;
  secp256k1_fe local_1048 [7];
  ulong local_f30 [4];
  uint uStack_f0c;
  secp256k1_gej local_f08 [7];
  undefined8 local_b60 [11];
  secp256k1_ge local_b08 [6];
  undefined8 local_8c8 [5];
  undefined8 local_8a0 [11];
  secp256k1_gej local_848 [7];
  undefined8 local_4c8 [10];
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  uint auStack_44c [257];
  uint local_48;
  long local_40;
  
  bVar1167 = 0;
  puVar1166 = local_b60;
  puVar1164 = &local_1070;
  puVar1144 = local_8c8;
  local_1320 = -1;
  local_1148 = ctx;
  if (((na->d[1] == 0 && na->d[0] == 0) && na->d[2] == 0) && na->d[3] == 0) {
    local_1308 = 0;
    bVar1125 = false;
  }
  else {
    local_1308 = 0;
    bVar1125 = false;
    if (a->infinity == 0) {
      puVar1166 = local_8a0;
      puVar1164 = local_f30;
      puVar1144 = local_4c8;
      local_40 = 0;
      local_48 = secp256k1_ecmult_wnaf
                           ((int *)(auStack_44c + 1),(int)na,(secp256k1_scalar *)0x5,(int)na);
      na = (secp256k1_scalar *)0x0;
      if (0 < (int)local_48) {
        na = (secp256k1_scalar *)(ulong)local_48;
      }
      local_1308 = (uint)na;
      local_1320 = 7;
      bVar1125 = true;
    }
  }
  lVar1165 = local_40;
  iVar1127 = (int)na;
  if (bVar1125) {
    psVar1145 = a + local_40;
    local_1150 = ng;
    secp256k1_gej_double_var(local_f08,psVar1145,(secp256k1_fe *)0x0);
    local_10c8.x.n[4] = local_f08[0].x.n[4];
    local_10c8.x.n[2] = local_f08[0].x.n[2];
    local_10c8.x.n[3] = local_f08[0].x.n[3];
    local_10c8.x.n[0] = local_f08[0].x.n[0];
    local_10c8.x.n[1] = local_f08[0].x.n[1];
    local_10c8.y.n[0] = local_f08[0].y.n[0];
    local_10c8.y.n[1] = local_f08[0].y.n[1];
    local_10c8.y.n[2] = local_f08[0].y.n[2];
    local_10c8.y.n[3] = local_f08[0].y.n[3];
    local_10c8.y.n[4] = local_f08[0].y.n[4];
    local_10c8.infinity = 0;
    secp256k1_ge_set_gej_zinv(&local_1248,psVar1145,&local_f08[0].z);
    local_848[0].x.n[4] = local_1248.x.n[4];
    local_848[0].x.n[2] = local_1248.x.n[2];
    local_848[0].x.n[3] = local_1248.x.n[3];
    local_848[0].x.n[0] = local_1248.x.n[0];
    local_848[0].x.n[1] = local_1248.x.n[1];
    local_848[0].y.n[0] = local_1248.y.n[0];
    local_848[0].y.n[1] = local_1248.y.n[1];
    local_848[0].y.n[2] = local_1248.y.n[2];
    local_848[0].y.n[3] = local_1248.y.n[3];
    local_848[0].y.n[4] = local_1248.y.n[4];
    local_848[0].z.n[0] = a[lVar1165].z.n[0];
    local_848[0].z.n[1] = a[lVar1165].z.n[1];
    puVar2 = a[lVar1165].z.n + 2;
    local_848[0].z.n[2] = *puVar2;
    local_848[0].z.n[3] = puVar2[1];
    local_848[0].z.n[4] = a[lVar1165].z.n[4];
    local_848[0].infinity = 0;
    local_1048[0].n[4] = local_f08[0].z.n[4];
    local_1048[0].n[2] = local_f08[0].z.n[2];
    local_1048[0].n[3] = local_f08[0].z.n[3];
    local_1048[0].n[0] = local_f08[0].z.n[0];
    local_1048[0].n[1] = local_f08[0].z.n[1];
    lVar1165 = 0x28;
    psVar1145 = local_848;
    do {
      secp256k1_gej_add_ge_var
                (psVar1145 + 1,psVar1145,&local_10c8,
                 (secp256k1_fe *)((long)local_1048[0].n + lVar1165));
      uVar1153 = uStack_470;
      uVar1132 = local_478;
      lVar1165 = lVar1165 + 0x28;
      psVar1145 = psVar1145 + 1;
    } while (lVar1165 != 0x140);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_f08[0].z.n[0];
    auVar534._8_8_ = 0;
    auVar534._0_8_ = uStack_460;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_f08[0].z.n[1];
    auVar535._8_8_ = 0;
    auVar535._0_8_ = local_468;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_f08[0].z.n[2];
    auVar536._8_8_ = 0;
    auVar536._0_8_ = uStack_470;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_f08[0].z.n[3];
    auVar537._8_8_ = 0;
    auVar537._0_8_ = local_478;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_f08[0].z.n[4];
    auVar538._8_8_ = 0;
    auVar538._0_8_ = local_458;
    uVar1128 = SUB168(auVar8 * auVar538,0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar1128 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar535 + auVar4 * auVar534 + auVar6 * auVar536 + auVar7 * auVar537 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar1131 = auVar4._0_8_;
    local_1140 = uVar1131 & 0xfffffffffffff;
    auVar988._8_8_ = 0;
    auVar988._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_f08[0].z.n[0];
    auVar539._8_8_ = 0;
    auVar539._0_8_ = local_458;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_f08[0].z.n[1];
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uStack_460;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_f08[0].z.n[2];
    auVar541._8_8_ = 0;
    auVar541._0_8_ = local_468;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_f08[0].z.n[3];
    auVar542._8_8_ = 0;
    auVar542._0_8_ = uStack_470;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_f08[0].z.n[4];
    auVar543._8_8_ = 0;
    auVar543._0_8_ = local_478;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1128 >> 0x34 | SUB168(auVar8 * auVar538,8) << 0xc;
    auVar4 = auVar10 * auVar539 + auVar988 + auVar11 * auVar540 + auVar12 * auVar541 +
             auVar13 * auVar542 + auVar14 * auVar543 + auVar15 * ZEXT816(0x1000003d10);
    uVar1128 = auVar4._0_8_;
    auVar989._8_8_ = 0;
    auVar989._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
    local_11c8 = (uVar1128 & 0xfffffffffffff) >> 0x30;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_f08[0].z.n[0];
    auVar544._8_8_ = 0;
    auVar544._0_8_ = local_478;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_f08[0].z.n[1];
    auVar545._8_8_ = 0;
    auVar545._0_8_ = local_458;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_f08[0].z.n[2];
    auVar546._8_8_ = 0;
    auVar546._0_8_ = uStack_460;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_f08[0].z.n[3];
    auVar547._8_8_ = 0;
    auVar547._0_8_ = local_468;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_f08[0].z.n[4];
    auVar548._8_8_ = 0;
    auVar548._0_8_ = uStack_470;
    auVar4 = auVar17 * auVar545 + auVar989 + auVar18 * auVar546 + auVar19 * auVar547 +
             auVar20 * auVar548;
    uVar1131 = auVar4._0_8_;
    auVar991._8_8_ = 0;
    auVar991._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar549._8_8_ = 0;
    auVar549._0_8_ = (uVar1131 & 0xfffffffffffff) << 4 | local_11c8;
    auVar4 = auVar16 * auVar544 + ZEXT816(0x1000003d1) * auVar549;
    uVar1131 = auVar4._0_8_;
    local_478 = uVar1131 & 0xfffffffffffff;
    auVar990._8_8_ = 0;
    auVar990._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_f08[0].z.n[0];
    auVar550._8_8_ = 0;
    auVar550._0_8_ = uStack_470;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_f08[0].z.n[1];
    auVar551._8_8_ = 0;
    auVar551._0_8_ = uVar1132;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_f08[0].z.n[2];
    auVar552._8_8_ = 0;
    auVar552._0_8_ = local_458;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_f08[0].z.n[3];
    auVar553._8_8_ = 0;
    auVar553._0_8_ = uStack_460;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_f08[0].z.n[4];
    auVar554._8_8_ = 0;
    auVar554._0_8_ = local_468;
    auVar5 = auVar23 * auVar552 + auVar991 + auVar24 * auVar553 + auVar25 * auVar554;
    uVar1131 = auVar5._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar1131 & 0xfffffffffffff;
    auVar4 = auVar21 * auVar550 + auVar990 + auVar22 * auVar551 + auVar26 * ZEXT816(0x1000003d10);
    uVar1152 = auVar4._0_8_;
    auVar993._8_8_ = 0;
    auVar993._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
    uStack_470 = uVar1152 & 0xfffffffffffff;
    auVar992._8_8_ = 0;
    auVar992._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_f08[0].z.n[0];
    auVar555._8_8_ = 0;
    auVar555._0_8_ = local_468;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_f08[0].z.n[1];
    auVar556._8_8_ = 0;
    auVar556._0_8_ = uVar1153;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_f08[0].z.n[2];
    auVar557._8_8_ = 0;
    auVar557._0_8_ = uVar1132;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_f08[0].z.n[3];
    auVar558._8_8_ = 0;
    auVar558._0_8_ = local_458;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_f08[0].z.n[4];
    auVar559._8_8_ = 0;
    auVar559._0_8_ = uStack_460;
    auVar5 = auVar30 * auVar558 + auVar993 + auVar31 * auVar559;
    uVar1132 = auVar5._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar1132 & 0xfffffffffffff;
    auVar4 = auVar27 * auVar555 + auVar992 + auVar28 * auVar556 + auVar29 * auVar557 +
             auVar32 * ZEXT816(0x1000003d10);
    uVar1153 = auVar4._0_8_;
    local_468 = uVar1153 & 0xfffffffffffff;
    auVar994._8_8_ = 0;
    auVar994._0_8_ = (uVar1153 >> 0x34 | auVar4._8_8_ << 0xc) + local_1140;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1132 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar994 = auVar33 * ZEXT816(0x1000003d10) + auVar994;
    uVar1132 = auVar994._0_8_;
    uStack_460 = uVar1132 & 0xfffffffffffff;
    local_458 = (uVar1132 >> 0x34 | auVar994._8_8_ << 0xc) + (uVar1128 & 0xffffffffffff);
    puVar1166[4] = puVar1144[4];
    uVar1122 = *puVar1144;
    uVar1123 = puVar1144[1];
    uVar1124 = puVar1144[3];
    puVar1166[2] = puVar1144[2];
    puVar1166[3] = uVar1124;
    *puVar1166 = uVar1122;
    puVar1166[1] = uVar1123;
    uVar1122 = puVar1144[6];
    uVar1123 = puVar1144[7];
    uVar1124 = puVar1144[8];
    puVar1166[5] = puVar1144[5];
    puVar1166[6] = uVar1122;
    puVar1166[7] = uVar1123;
    puVar1166[8] = uVar1124;
    puVar1166[9] = puVar1144[9];
    secp256k1_fe_normalize_weak((secp256k1_fe *)(puVar1166 + 5));
    local_1158 = puVar1144[0xe];
    local_1178 = puVar1144[10];
    uStack_1170 = puVar1144[0xb];
    local_1168 = puVar1144[0xc];
    uStack_1160 = puVar1144[0xd];
    *(undefined4 *)(puVar1166 + 10) = 0;
    local_f08[0].x.n[4] = puVar1164[4];
    local_f08[0].x.n[2] = puVar1164[2];
    local_f08[0].x.n[3] = puVar1164[3];
    local_f08[0].x.n[0] = *puVar1164;
    local_f08[0].x.n[1] = puVar1164[1];
    psVar1145 = local_848 + local_1320;
    psVar1133 = local_b08;
    psVar1146 = psVar1133 + local_1320;
    psVar1143 = local_1048 + local_1320;
    lVar1165 = 0;
    do {
      uVar1149 = local_f08[0].x.n[1];
      uVar1137 = local_f08[0].x.n[0];
      psVar1146 = psVar1146 + -1;
      psVar1145 = psVar1145 + -1;
      if (lVar1165 != 0) {
        auVar34._8_8_ = 0;
        auVar34._0_8_ = psVar1143->n[0];
        auVar560._8_8_ = 0;
        auVar560._0_8_ = local_f08[0].x.n[3];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = psVar1143->n[1];
        auVar561._8_8_ = 0;
        auVar561._0_8_ = local_f08[0].x.n[2];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = psVar1143->n[2];
        auVar562._8_8_ = 0;
        auVar562._0_8_ = local_f08[0].x.n[1];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = psVar1143->n[3];
        auVar563._8_8_ = 0;
        auVar563._0_8_ = local_f08[0].x.n[0];
        auVar38._8_8_ = 0;
        auVar38._0_8_ = psVar1143->n[4];
        auVar564._8_8_ = 0;
        auVar564._0_8_ = local_f08[0].x.n[4];
        uVar1132 = SUB168(auVar38 * auVar564,0);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar1132 & 0xfffffffffffff;
        auVar4 = auVar35 * auVar561 + auVar34 * auVar560 + auVar36 * auVar562 + auVar37 * auVar563 +
                 auVar39 * ZEXT816(0x1000003d10);
        uVar1153 = auVar4._0_8_;
        local_1248.x.n[0] = uVar1153 & 0xfffffffffffff;
        auVar995._8_8_ = 0;
        auVar995._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = psVar1143->n[0];
        auVar565._8_8_ = 0;
        auVar565._0_8_ = local_f08[0].x.n[4];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = psVar1143->n[1];
        auVar566._8_8_ = 0;
        auVar566._0_8_ = local_f08[0].x.n[3];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = psVar1143->n[2];
        auVar567._8_8_ = 0;
        auVar567._0_8_ = local_f08[0].x.n[2];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = psVar1143->n[3];
        auVar568._8_8_ = 0;
        auVar568._0_8_ = local_f08[0].x.n[1];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = psVar1143->n[4];
        auVar569._8_8_ = 0;
        auVar569._0_8_ = local_f08[0].x.n[0];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar1132 >> 0x34 | SUB168(auVar38 * auVar564,8) << 0xc;
        auVar4 = auVar40 * auVar565 + auVar995 + auVar41 * auVar566 + auVar42 * auVar567 +
                 auVar43 * auVar568 + auVar44 * auVar569 + auVar45 * ZEXT816(0x1000003d10);
        local_10c8.x.n[0] = auVar4._0_8_;
        auVar996._8_8_ = 0;
        auVar996._0_8_ = local_10c8.x.n[0] >> 0x34 | auVar4._8_8_ << 0xc;
        local_1140 = (local_10c8.x.n[0] & 0xfffffffffffff) >> 0x30;
        local_10c8.x.n[0] = local_10c8.x.n[0] & 0xffffffffffff;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = psVar1143->n[0];
        auVar570._8_8_ = 0;
        auVar570._0_8_ = local_f08[0].x.n[0];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = psVar1143->n[1];
        auVar571._8_8_ = 0;
        auVar571._0_8_ = local_f08[0].x.n[4];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = psVar1143->n[2];
        auVar572._8_8_ = 0;
        auVar572._0_8_ = local_f08[0].x.n[3];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = psVar1143->n[3];
        auVar573._8_8_ = 0;
        auVar573._0_8_ = local_f08[0].x.n[2];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = psVar1143->n[4];
        auVar574._8_8_ = 0;
        auVar574._0_8_ = local_f08[0].x.n[1];
        auVar4 = auVar47 * auVar571 + auVar996 + auVar48 * auVar572 + auVar49 * auVar573 +
                 auVar50 * auVar574;
        uVar1132 = auVar4._0_8_;
        auVar998._8_8_ = 0;
        auVar998._0_8_ = uVar1132 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar575._8_8_ = 0;
        auVar575._0_8_ = (uVar1132 & 0xfffffffffffff) << 4 | local_1140;
        auVar4 = auVar46 * auVar570 + ZEXT816(0x1000003d1) * auVar575;
        uVar1132 = auVar4._0_8_;
        local_f08[0].x.n[0] = uVar1132 & 0xfffffffffffff;
        auVar997._8_8_ = 0;
        auVar997._0_8_ = uVar1132 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = psVar1143->n[0];
        auVar576._8_8_ = 0;
        auVar576._0_8_ = local_f08[0].x.n[1];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = psVar1143->n[1];
        auVar577._8_8_ = 0;
        auVar577._0_8_ = uVar1137;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = psVar1143->n[2];
        auVar578._8_8_ = 0;
        auVar578._0_8_ = local_f08[0].x.n[4];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = psVar1143->n[3];
        auVar579._8_8_ = 0;
        auVar579._0_8_ = local_f08[0].x.n[3];
        auVar55._8_8_ = 0;
        auVar55._0_8_ = psVar1143->n[4];
        auVar580._8_8_ = 0;
        auVar580._0_8_ = local_f08[0].x.n[2];
        auVar5 = auVar53 * auVar578 + auVar998 + auVar54 * auVar579 + auVar55 * auVar580;
        uVar1132 = auVar5._0_8_;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar1132 & 0xfffffffffffff;
        auVar4 = auVar51 * auVar576 + auVar997 + auVar52 * auVar577 +
                 auVar56 * ZEXT816(0x1000003d10);
        uVar1153 = auVar4._0_8_;
        auVar1000._8_8_ = 0;
        auVar1000._0_8_ = uVar1132 >> 0x34 | auVar5._8_8_ << 0xc;
        local_f08[0].x.n[1] = uVar1153 & 0xfffffffffffff;
        auVar999._8_8_ = 0;
        auVar999._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = psVar1143->n[0];
        auVar581._8_8_ = 0;
        auVar581._0_8_ = local_f08[0].x.n[2];
        auVar58._8_8_ = 0;
        auVar58._0_8_ = psVar1143->n[1];
        auVar582._8_8_ = 0;
        auVar582._0_8_ = uVar1149;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = psVar1143->n[2];
        auVar583._8_8_ = 0;
        auVar583._0_8_ = uVar1137;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = psVar1143->n[3];
        auVar584._8_8_ = 0;
        auVar584._0_8_ = local_f08[0].x.n[4];
        auVar61._8_8_ = 0;
        auVar61._0_8_ = psVar1143->n[4];
        auVar585._8_8_ = 0;
        auVar585._0_8_ = local_f08[0].x.n[3];
        auVar5 = auVar60 * auVar584 + auVar1000 + auVar61 * auVar585;
        uVar1132 = auVar5._0_8_;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar1132 & 0xfffffffffffff;
        auVar4 = auVar57 * auVar581 + auVar999 + auVar58 * auVar582 + auVar59 * auVar583 +
                 auVar62 * ZEXT816(0x1000003d10);
        uVar1153 = auVar4._0_8_;
        psVar1133 = (secp256k1_ge *)(uVar1132 >> 0x34 | auVar5._8_8_ << 0xc);
        local_f08[0].x.n[2] = uVar1153 & 0xfffffffffffff;
        auVar1001._8_8_ = 0;
        auVar1001._0_8_ = (uVar1153 >> 0x34 | auVar4._8_8_ << 0xc) + local_1248.x.n[0];
        auVar63._8_8_ = 0;
        auVar63._0_8_ = psVar1133;
        auVar1001 = auVar63 * ZEXT816(0x1000003d10) + auVar1001;
        uVar1132 = auVar1001._0_8_;
        local_f08[0].x.n[3] = uVar1132 & 0xfffffffffffff;
        local_f08[0].x.n[4] = (uVar1132 >> 0x34 | auVar1001._8_8_ << 0xc) + local_10c8.x.n[0];
      }
      secp256k1_ge_set_gej_zinv(psVar1146,psVar1145,&local_f08[0].x);
      iVar1127 = (int)psVar1133;
      lVar1165 = lVar1165 + 1;
      psVar1143 = psVar1143 + -1;
      ng = local_1150;
    } while (local_1320 != lVar1165);
  }
  else {
    local_1178 = 1;
    uStack_1170 = 0;
    local_1168 = 0;
    uStack_1160 = 0;
    local_1158 = 0;
  }
  if (ng == (secp256k1_scalar *)0x0) {
    lVar1165 = 0;
  }
  else {
    uVar1126 = secp256k1_ecmult_wnaf((int *)local_f08,(int)ng,(secp256k1_scalar *)0xf,iVar1127);
    if ((int)local_1308 < (int)uVar1126) {
      local_1308 = uVar1126;
    }
    lVar1165 = (long)(int)uVar1126;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (0 < (int)local_1308) {
    psVar1143 = &r->y;
    psVar1 = &r->z;
    uVar1132 = (ulong)local_1308;
    do {
      secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
      if (((bool)((long)uVar1132 <= (long)(int)local_48 & bVar1125)) &&
         (uVar1126 = auStack_44c[uVar1132], uVar1126 != 0)) {
        if ((int)uVar1126 < 1) {
          psVar1146 = local_b08 + (~uVar1126 >> 1);
          psVar1133 = &local_1248;
          for (lVar1134 = 0xb; lVar1134 != 0; lVar1134 = lVar1134 + -1) {
            (psVar1133->x).n[0] = (psVar1146->x).n[0];
            psVar1146 = (secp256k1_ge *)((long)psVar1146 + ((ulong)bVar1167 * -2 + 1) * 8);
            psVar1133 = (secp256k1_ge *)((long)psVar1133 + ((ulong)bVar1167 * -2 + 1) * 8);
          }
          local_1248.y.n[0] = 0x3ffffbfffff0bc - local_1248.y.n[0];
          local_1248.y.n[1] = 0x3ffffffffffffc - local_1248.y.n[1];
          local_1248.y.n[2] = 0x3ffffffffffffc - local_1248.y.n[2];
          local_1248.y.n[3] = 0x3ffffffffffffc - local_1248.y.n[3];
          local_1248.y.n[4] = 0x3fffffffffffc - local_1248.y.n[4];
        }
        else {
          psVar1146 = local_b08 + (uVar1126 - 1 >> 1);
          psVar1133 = &local_1248;
          for (lVar1134 = 0xb; lVar1134 != 0; lVar1134 = lVar1134 + -1) {
            (psVar1133->x).n[0] = (psVar1146->x).n[0];
            psVar1146 = (secp256k1_ge *)((long)psVar1146 + ((ulong)bVar1167 * -2 + 1) * 8);
            psVar1133 = (secp256k1_ge *)((long)psVar1133 + ((ulong)bVar1167 * -2 + 1) * 8);
          }
        }
        secp256k1_gej_add_ge_var(r,r,&local_1248,(secp256k1_fe *)0x0);
      }
      if (((long)uVar1132 <= lVar1165) && (uVar1126 = (&uStack_f0c)[uVar1132], uVar1126 != 0)) {
        if ((int)uVar1126 < 1) {
          secp256k1_ge_from_storage
                    (&local_1248,
                     (secp256k1_ge_storage *)(local_1148->pre_g + (ulong)(~uVar1126 >> 1) * 0x40));
          local_1248.y.n[0] = 0x3ffffbfffff0bc - local_1248.y.n[0];
          local_1248.y.n[1] = 0x3ffffffffffffc - local_1248.y.n[1];
          local_1248.y.n[2] = 0x3ffffffffffffc - local_1248.y.n[2];
          local_1248.y.n[3] = 0x3ffffffffffffc - local_1248.y.n[3];
          local_1248.y.n[4] = 0x3fffffffffffc - local_1248.y.n[4];
        }
        else {
          secp256k1_ge_from_storage
                    (&local_1248,
                     (secp256k1_ge_storage *)(local_1148->pre_g + (ulong)(uVar1126 - 1 >> 1) * 0x40)
                    );
        }
        if (local_1248.infinity == 0) {
          if (r->infinity == 0) {
            r->infinity = 0;
            uVar1153 = psVar1->n[0];
            uVar1128 = (r->z).n[1];
            uVar1131 = (r->z).n[2];
            uVar1152 = (r->z).n[3];
            uVar1154 = (r->z).n[4];
            auVar174._8_8_ = 0;
            auVar174._0_8_ = local_1178;
            auVar680._8_8_ = 0;
            auVar680._0_8_ = uVar1152;
            auVar175._8_8_ = 0;
            auVar175._0_8_ = uStack_1170;
            auVar681._8_8_ = 0;
            auVar681._0_8_ = uVar1131;
            auVar176._8_8_ = 0;
            auVar176._0_8_ = local_1168;
            auVar682._8_8_ = 0;
            auVar682._0_8_ = uVar1128;
            auVar177._8_8_ = 0;
            auVar177._0_8_ = uStack_1160;
            auVar683._8_8_ = 0;
            auVar683._0_8_ = uVar1153;
            auVar178._8_8_ = 0;
            auVar178._0_8_ = local_1158;
            auVar684._8_8_ = 0;
            auVar684._0_8_ = uVar1154;
            uVar1138 = SUB168(auVar178 * auVar684,0);
            auVar179._8_8_ = 0;
            auVar179._0_8_ = uVar1138 & 0xfffffffffffff;
            auVar4 = auVar175 * auVar681 + auVar174 * auVar680 + auVar176 * auVar682 +
                     auVar177 * auVar683 + auVar179 * ZEXT816(0x1000003d10);
            uVar1139 = auVar4._0_8_;
            auVar1030._8_8_ = 0;
            auVar1030._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar180._8_8_ = 0;
            auVar180._0_8_ = local_1178;
            auVar685._8_8_ = 0;
            auVar685._0_8_ = uVar1154;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = uStack_1170;
            auVar686._8_8_ = 0;
            auVar686._0_8_ = uVar1152;
            auVar182._8_8_ = 0;
            auVar182._0_8_ = local_1168;
            auVar687._8_8_ = 0;
            auVar687._0_8_ = uVar1131;
            auVar183._8_8_ = 0;
            auVar183._0_8_ = uStack_1160;
            auVar688._8_8_ = 0;
            auVar688._0_8_ = uVar1128;
            auVar184._8_8_ = 0;
            auVar184._0_8_ = local_1158;
            auVar689._8_8_ = 0;
            auVar689._0_8_ = uVar1153;
            auVar185._8_8_ = 0;
            auVar185._0_8_ = uVar1138 >> 0x34 | SUB168(auVar178 * auVar684,8) << 0xc;
            auVar4 = auVar180 * auVar685 + auVar1030 + auVar181 * auVar686 + auVar182 * auVar687 +
                     auVar183 * auVar688 + auVar184 * auVar689 + auVar185 * ZEXT816(0x1000003d10);
            uVar1138 = auVar4._0_8_;
            auVar1031._8_8_ = 0;
            auVar1031._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar186._8_8_ = 0;
            auVar186._0_8_ = local_1178;
            auVar690._8_8_ = 0;
            auVar690._0_8_ = uVar1153;
            auVar187._8_8_ = 0;
            auVar187._0_8_ = uStack_1170;
            auVar691._8_8_ = 0;
            auVar691._0_8_ = uVar1154;
            auVar188._8_8_ = 0;
            auVar188._0_8_ = local_1168;
            auVar692._8_8_ = 0;
            auVar692._0_8_ = uVar1152;
            auVar189._8_8_ = 0;
            auVar189._0_8_ = uStack_1160;
            auVar693._8_8_ = 0;
            auVar693._0_8_ = uVar1131;
            auVar190._8_8_ = 0;
            auVar190._0_8_ = local_1158;
            auVar694._8_8_ = 0;
            auVar694._0_8_ = uVar1128;
            auVar4 = auVar187 * auVar691 + auVar1031 + auVar188 * auVar692 + auVar189 * auVar693 +
                     auVar190 * auVar694;
            uVar1163 = auVar4._0_8_;
            auVar1033._8_8_ = 0;
            auVar1033._0_8_ = uVar1163 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar695._8_8_ = 0;
            auVar695._0_8_ =
                 (uVar1163 & 0xfffffffffffff) << 4 | (uVar1138 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar186 * auVar690 + ZEXT816(0x1000003d1) * auVar695;
            uVar1163 = auVar4._0_8_;
            local_10c8.x.n[0] = uVar1163 & 0xfffffffffffff;
            auVar1032._8_8_ = 0;
            auVar1032._0_8_ = uVar1163 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar191._8_8_ = 0;
            auVar191._0_8_ = local_1178;
            auVar696._8_8_ = 0;
            auVar696._0_8_ = uVar1128;
            auVar192._8_8_ = 0;
            auVar192._0_8_ = uStack_1170;
            auVar697._8_8_ = 0;
            auVar697._0_8_ = uVar1153;
            auVar193._8_8_ = 0;
            auVar193._0_8_ = local_1168;
            auVar698._8_8_ = 0;
            auVar698._0_8_ = uVar1154;
            auVar194._8_8_ = 0;
            auVar194._0_8_ = uStack_1160;
            auVar699._8_8_ = 0;
            auVar699._0_8_ = uVar1152;
            auVar195._8_8_ = 0;
            auVar195._0_8_ = local_1158;
            auVar700._8_8_ = 0;
            auVar700._0_8_ = uVar1131;
            auVar5 = auVar193 * auVar698 + auVar1033 + auVar194 * auVar699 + auVar195 * auVar700;
            uVar1163 = auVar5._0_8_;
            auVar196._8_8_ = 0;
            auVar196._0_8_ = uVar1163 & 0xfffffffffffff;
            auVar4 = auVar191 * auVar696 + auVar1032 + auVar192 * auVar697 +
                     auVar196 * ZEXT816(0x1000003d10);
            uVar1155 = auVar4._0_8_;
            auVar1035._8_8_ = 0;
            auVar1035._0_8_ = uVar1163 >> 0x34 | auVar5._8_8_ << 0xc;
            local_10c8.x.n[1] = uVar1155 & 0xfffffffffffff;
            auVar1034._8_8_ = 0;
            auVar1034._0_8_ = uVar1155 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar197._8_8_ = 0;
            auVar197._0_8_ = local_1178;
            auVar701._8_8_ = 0;
            auVar701._0_8_ = uVar1131;
            auVar198._8_8_ = 0;
            auVar198._0_8_ = uStack_1170;
            auVar702._8_8_ = 0;
            auVar702._0_8_ = uVar1128;
            auVar199._8_8_ = 0;
            auVar199._0_8_ = local_1168;
            auVar703._8_8_ = 0;
            auVar703._0_8_ = uVar1153;
            auVar200._8_8_ = 0;
            auVar200._0_8_ = uStack_1160;
            auVar704._8_8_ = 0;
            auVar704._0_8_ = uVar1154;
            auVar201._8_8_ = 0;
            auVar201._0_8_ = local_1158;
            auVar705._8_8_ = 0;
            auVar705._0_8_ = uVar1152;
            auVar5 = auVar200 * auVar704 + auVar1035 + auVar201 * auVar705;
            uVar1153 = auVar5._0_8_;
            auVar202._8_8_ = 0;
            auVar202._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar197 * auVar701 + auVar1034 + auVar198 * auVar702 + auVar199 * auVar703 +
                     auVar202 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            local_10c8.x.n[2] = uVar1128 & 0xfffffffffffff;
            auVar1036._8_8_ = 0;
            auVar1036._0_8_ =
                 (uVar1128 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1139 & 0xfffffffffffff);
            auVar203._8_8_ = 0;
            auVar203._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1036 = auVar203 * ZEXT816(0x1000003d10) + auVar1036;
            uVar1153 = auVar1036._0_8_;
            local_10c8.x.n[3] = uVar1153 & 0xfffffffffffff;
            local_10c8.x.n[4] =
                 (uVar1153 >> 0x34 | auVar1036._8_8_ << 0xc) + (uVar1138 & 0xffffffffffff);
            auVar204._8_8_ = 0;
            auVar204._0_8_ = local_10c8.x.n[0] * 2;
            auVar706._8_8_ = 0;
            auVar706._0_8_ = local_10c8.x.n[3];
            auVar205._8_8_ = 0;
            auVar205._0_8_ = local_10c8.x.n[1] * 2;
            auVar707._8_8_ = 0;
            auVar707._0_8_ = local_10c8.x.n[2];
            auVar206._8_8_ = 0;
            auVar206._0_8_ = local_10c8.x.n[4];
            auVar708._8_8_ = 0;
            auVar708._0_8_ = local_10c8.x.n[4];
            uVar1128 = SUB168(auVar206 * auVar708,0);
            auVar207._8_8_ = 0;
            auVar207._0_8_ = uVar1128 & 0xfffffffffffff;
            auVar4 = auVar205 * auVar707 + auVar204 * auVar706 + auVar207 * ZEXT816(0x1000003d10);
            uVar1131 = auVar4._0_8_;
            auVar1037._8_8_ = 0;
            auVar1037._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            uVar1153 = local_10c8.x.n[4] * 2;
            auVar208._8_8_ = 0;
            auVar208._0_8_ = local_10c8.x.n[0];
            auVar709._8_8_ = 0;
            auVar709._0_8_ = uVar1153;
            auVar209._8_8_ = 0;
            auVar209._0_8_ = local_10c8.x.n[1] * 2;
            auVar710._8_8_ = 0;
            auVar710._0_8_ = local_10c8.x.n[3];
            auVar210._8_8_ = 0;
            auVar210._0_8_ = local_10c8.x.n[2];
            auVar711._8_8_ = 0;
            auVar711._0_8_ = local_10c8.x.n[2];
            auVar211._8_8_ = 0;
            auVar211._0_8_ = uVar1128 >> 0x34 | SUB168(auVar206 * auVar708,8) << 0xc;
            auVar4 = auVar208 * auVar709 + auVar1037 + auVar209 * auVar710 + auVar210 * auVar711 +
                     auVar211 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            auVar1038._8_8_ = 0;
            auVar1038._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar212._8_8_ = 0;
            auVar212._0_8_ = local_10c8.x.n[0];
            auVar712._8_8_ = 0;
            auVar712._0_8_ = local_10c8.x.n[0];
            auVar213._8_8_ = 0;
            auVar213._0_8_ = local_10c8.x.n[1];
            auVar713._8_8_ = 0;
            auVar713._0_8_ = uVar1153;
            auVar214._8_8_ = 0;
            auVar214._0_8_ = local_10c8.x.n[2] * 2;
            auVar714._8_8_ = 0;
            auVar714._0_8_ = local_10c8.x.n[3];
            auVar4 = auVar213 * auVar713 + auVar1038 + auVar214 * auVar714;
            uVar1152 = auVar4._0_8_;
            auVar1040._8_8_ = 0;
            auVar1040._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar715._8_8_ = 0;
            auVar715._0_8_ =
                 (uVar1152 & 0xfffffffffffff) << 4 | (uVar1128 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar212 * auVar712 + ZEXT816(0x1000003d1) * auVar715;
            uVar1152 = auVar4._0_8_;
            local_1140 = uVar1152 & 0xfffffffffffff;
            auVar1039._8_8_ = 0;
            auVar1039._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar215._8_8_ = 0;
            auVar215._0_8_ = local_10c8.x.n[0] * 2;
            auVar716._8_8_ = 0;
            auVar716._0_8_ = local_10c8.x.n[1];
            auVar216._8_8_ = 0;
            auVar216._0_8_ = local_10c8.x.n[2];
            auVar717._8_8_ = 0;
            auVar717._0_8_ = uVar1153;
            auVar217._8_8_ = 0;
            auVar217._0_8_ = local_10c8.x.n[3];
            auVar718._8_8_ = 0;
            auVar718._0_8_ = local_10c8.x.n[3];
            auVar5 = auVar216 * auVar717 + auVar1040 + auVar217 * auVar718;
            uVar1152 = auVar5._0_8_;
            auVar218._8_8_ = 0;
            auVar218._0_8_ = uVar1152 & 0xfffffffffffff;
            auVar4 = auVar215 * auVar716 + auVar1039 + auVar218 * ZEXT816(0x1000003d10);
            uVar1154 = auVar4._0_8_;
            auVar1042._8_8_ = 0;
            auVar1042._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
            local_1138 = uVar1154 & 0xfffffffffffff;
            auVar1041._8_8_ = 0;
            auVar1041._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar219._8_8_ = 0;
            auVar219._0_8_ = local_10c8.x.n[0] * 2;
            auVar719._8_8_ = 0;
            auVar719._0_8_ = local_10c8.x.n[2];
            auVar220._8_8_ = 0;
            auVar220._0_8_ = local_10c8.x.n[1];
            auVar720._8_8_ = 0;
            auVar720._0_8_ = local_10c8.x.n[1];
            auVar221._8_8_ = 0;
            auVar221._0_8_ = local_10c8.x.n[3];
            auVar721._8_8_ = 0;
            auVar721._0_8_ = uVar1153;
            auVar1042 = auVar221 * auVar721 + auVar1042;
            uVar1153 = auVar1042._0_8_;
            auVar222._8_8_ = 0;
            auVar222._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar219 * auVar719 + auVar1041 + auVar220 * auVar720 +
                     auVar222 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            local_1130 = uVar1152 & 0xfffffffffffff;
            auVar1043._8_8_ = 0;
            auVar1043._0_8_ =
                 (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1131 & 0xfffffffffffff);
            auVar223._8_8_ = 0;
            auVar223._0_8_ = uVar1153 >> 0x34 | auVar1042._8_8_ << 0xc;
            auVar1043 = auVar223 * ZEXT816(0x1000003d10) + auVar1043;
            uVar1153 = auVar1043._0_8_;
            local_1128 = uVar1153 & 0xfffffffffffff;
            local_1120 = (uVar1153 >> 0x34 | auVar1043._8_8_ << 0xc) + (uVar1128 & 0xffffffffffff);
            uVar1153 = (r->x).n[4];
            uVar1128 = (uVar1153 >> 0x30) * 0x1000003d1 + (r->x).n[0];
            uVar1140 = (uVar1128 >> 0x34) + (r->x).n[1];
            uVar1128 = uVar1128 & 0xfffffffffffff;
            uVar1147 = (uVar1140 >> 0x34) + (r->x).n[2];
            uVar1140 = uVar1140 & 0xfffffffffffff;
            uVar1150 = (uVar1147 >> 0x34) + (r->x).n[3];
            uVar1147 = uVar1147 & 0xfffffffffffff;
            uVar1156 = (uVar1150 >> 0x34) + (uVar1153 & 0xffffffffffff);
            uVar1150 = uVar1150 & 0xfffffffffffff;
            auVar224._8_8_ = 0;
            auVar224._0_8_ = local_1140;
            auVar722._8_8_ = 0;
            auVar722._0_8_ = local_1248.x.n[3];
            auVar225._8_8_ = 0;
            auVar225._0_8_ = local_1138;
            auVar723._8_8_ = 0;
            auVar723._0_8_ = local_1248.x.n[2];
            auVar226._8_8_ = 0;
            auVar226._0_8_ = local_1130;
            auVar724._8_8_ = 0;
            auVar724._0_8_ = local_1248.x.n[1];
            auVar227._8_8_ = 0;
            auVar227._0_8_ = local_1128;
            auVar725._8_8_ = 0;
            auVar725._0_8_ = local_1248.x.n[0];
            auVar228._8_8_ = 0;
            auVar228._0_8_ = local_1120;
            auVar726._8_8_ = 0;
            auVar726._0_8_ = local_1248.x.n[4];
            uVar1153 = SUB168(auVar228 * auVar726,0);
            auVar229._8_8_ = 0;
            auVar229._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar225 * auVar723 + auVar224 * auVar722 + auVar226 * auVar724 +
                     auVar227 * auVar725 + auVar229 * ZEXT816(0x1000003d10);
            uVar1131 = auVar4._0_8_;
            auVar1044._8_8_ = 0;
            auVar1044._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar230._8_8_ = 0;
            auVar230._0_8_ = local_1140;
            auVar727._8_8_ = 0;
            auVar727._0_8_ = local_1248.x.n[4];
            auVar231._8_8_ = 0;
            auVar231._0_8_ = local_1138;
            auVar728._8_8_ = 0;
            auVar728._0_8_ = local_1248.x.n[3];
            auVar232._8_8_ = 0;
            auVar232._0_8_ = local_1130;
            auVar729._8_8_ = 0;
            auVar729._0_8_ = local_1248.x.n[2];
            auVar233._8_8_ = 0;
            auVar233._0_8_ = local_1128;
            auVar730._8_8_ = 0;
            auVar730._0_8_ = local_1248.x.n[1];
            auVar234._8_8_ = 0;
            auVar234._0_8_ = local_1120;
            auVar731._8_8_ = 0;
            auVar731._0_8_ = local_1248.x.n[0];
            auVar235._8_8_ = 0;
            auVar235._0_8_ = uVar1153 >> 0x34 | SUB168(auVar228 * auVar726,8) << 0xc;
            auVar4 = auVar230 * auVar727 + auVar1044 + auVar231 * auVar728 + auVar232 * auVar729 +
                     auVar233 * auVar730 + auVar234 * auVar731 + auVar235 * ZEXT816(0x1000003d10);
            uVar1153 = auVar4._0_8_;
            auVar1045._8_8_ = 0;
            auVar1045._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar236._8_8_ = 0;
            auVar236._0_8_ = local_1140;
            auVar732._8_8_ = 0;
            auVar732._0_8_ = local_1248.x.n[0];
            auVar237._8_8_ = 0;
            auVar237._0_8_ = local_1138;
            auVar733._8_8_ = 0;
            auVar733._0_8_ = local_1248.x.n[4];
            auVar238._8_8_ = 0;
            auVar238._0_8_ = local_1130;
            auVar734._8_8_ = 0;
            auVar734._0_8_ = local_1248.x.n[3];
            auVar239._8_8_ = 0;
            auVar239._0_8_ = local_1128;
            auVar735._8_8_ = 0;
            auVar735._0_8_ = local_1248.x.n[2];
            auVar240._8_8_ = 0;
            auVar240._0_8_ = local_1120;
            auVar736._8_8_ = 0;
            auVar736._0_8_ = local_1248.x.n[1];
            auVar4 = auVar237 * auVar733 + auVar1045 + auVar238 * auVar734 + auVar239 * auVar735 +
                     auVar240 * auVar736;
            uVar1152 = auVar4._0_8_;
            auVar1047._8_8_ = 0;
            auVar1047._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar737._8_8_ = 0;
            auVar737._0_8_ =
                 (uVar1152 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar236 * auVar732 + ZEXT816(0x1000003d1) * auVar737;
            uVar1152 = auVar4._0_8_;
            local_11c8 = uVar1152 & 0xfffffffffffff;
            auVar1046._8_8_ = 0;
            auVar1046._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar241._8_8_ = 0;
            auVar241._0_8_ = local_1140;
            auVar738._8_8_ = 0;
            auVar738._0_8_ = local_1248.x.n[1];
            auVar242._8_8_ = 0;
            auVar242._0_8_ = local_1138;
            auVar739._8_8_ = 0;
            auVar739._0_8_ = local_1248.x.n[0];
            auVar243._8_8_ = 0;
            auVar243._0_8_ = local_1130;
            auVar740._8_8_ = 0;
            auVar740._0_8_ = local_1248.x.n[4];
            auVar244._8_8_ = 0;
            auVar244._0_8_ = local_1128;
            auVar741._8_8_ = 0;
            auVar741._0_8_ = local_1248.x.n[3];
            auVar245._8_8_ = 0;
            auVar245._0_8_ = local_1120;
            auVar742._8_8_ = 0;
            auVar742._0_8_ = local_1248.x.n[2];
            auVar5 = auVar243 * auVar740 + auVar1047 + auVar244 * auVar741 + auVar245 * auVar742;
            uVar1152 = auVar5._0_8_;
            auVar246._8_8_ = 0;
            auVar246._0_8_ = uVar1152 & 0xfffffffffffff;
            auVar4 = auVar241 * auVar738 + auVar1046 + auVar242 * auVar739 +
                     auVar246 * ZEXT816(0x1000003d10);
            uVar1154 = auVar4._0_8_;
            auVar1049._8_8_ = 0;
            auVar1049._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
            local_11c0 = uVar1154 & 0xfffffffffffff;
            auVar1048._8_8_ = 0;
            auVar1048._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar247._8_8_ = 0;
            auVar247._0_8_ = local_1140;
            auVar743._8_8_ = 0;
            auVar743._0_8_ = local_1248.x.n[2];
            auVar248._8_8_ = 0;
            auVar248._0_8_ = local_1138;
            auVar744._8_8_ = 0;
            auVar744._0_8_ = local_1248.x.n[1];
            auVar249._8_8_ = 0;
            auVar249._0_8_ = local_1130;
            auVar745._8_8_ = 0;
            auVar745._0_8_ = local_1248.x.n[0];
            auVar250._8_8_ = 0;
            auVar250._0_8_ = local_1128;
            auVar746._8_8_ = 0;
            auVar746._0_8_ = local_1248.x.n[4];
            auVar251._8_8_ = 0;
            auVar251._0_8_ = local_1120;
            auVar747._8_8_ = 0;
            auVar747._0_8_ = local_1248.x.n[3];
            auVar5 = auVar250 * auVar746 + auVar1049 + auVar251 * auVar747;
            uVar1152 = auVar5._0_8_;
            auVar252._8_8_ = 0;
            auVar252._0_8_ = uVar1152 & 0xfffffffffffff;
            auVar4 = auVar247 * auVar743 + auVar1048 + auVar248 * auVar744 + auVar249 * auVar745 +
                     auVar252 * ZEXT816(0x1000003d10);
            uVar1154 = auVar4._0_8_;
            local_11b8 = uVar1154 & 0xfffffffffffff;
            auVar1050._8_8_ = 0;
            auVar1050._0_8_ =
                 (uVar1154 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1131 & 0xfffffffffffff);
            auVar253._8_8_ = 0;
            auVar253._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1050 = auVar253 * ZEXT816(0x1000003d10) + auVar1050;
            uVar1131 = auVar1050._0_8_;
            local_11b0 = uVar1131 & 0xfffffffffffff;
            local_11a8 = (uVar1131 >> 0x34 | auVar1050._8_8_ << 0xc) + (uVar1153 & 0xffffffffffff);
            uVar1153 = (r->y).n[4];
            uVar1131 = (uVar1153 >> 0x30) * 0x1000003d1 + psVar1143->n[0];
            uVar1141 = (uVar1131 >> 0x34) + (r->y).n[1];
            uVar1131 = uVar1131 & 0xfffffffffffff;
            uVar1148 = (uVar1141 >> 0x34) + (r->y).n[2];
            uVar1141 = uVar1141 & 0xfffffffffffff;
            uVar1151 = (uVar1148 >> 0x34) + (r->y).n[3];
            uVar1148 = uVar1148 & 0xfffffffffffff;
            uVar1157 = (uVar1151 >> 0x34) + (uVar1153 & 0xffffffffffff);
            uVar1151 = uVar1151 & 0xfffffffffffff;
            auVar254._8_8_ = 0;
            auVar254._0_8_ = local_1140;
            auVar748._8_8_ = 0;
            auVar748._0_8_ = local_1248.y.n[3];
            auVar255._8_8_ = 0;
            auVar255._0_8_ = local_1138;
            auVar749._8_8_ = 0;
            auVar749._0_8_ = local_1248.y.n[2];
            auVar256._8_8_ = 0;
            auVar256._0_8_ = local_1130;
            auVar750._8_8_ = 0;
            auVar750._0_8_ = local_1248.y.n[1];
            auVar257._8_8_ = 0;
            auVar257._0_8_ = local_1128;
            auVar751._8_8_ = 0;
            auVar751._0_8_ = local_1248.y.n[0];
            auVar258._8_8_ = 0;
            auVar258._0_8_ = local_1120;
            auVar752._8_8_ = 0;
            auVar752._0_8_ = local_1248.y.n[4];
            uVar1153 = SUB168(auVar258 * auVar752,0);
            auVar259._8_8_ = 0;
            auVar259._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar255 * auVar749 + auVar254 * auVar748 + auVar256 * auVar750 +
                     auVar257 * auVar751 + auVar259 * ZEXT816(0x1000003d10);
            uVar1138 = auVar4._0_8_;
            auVar1051._8_8_ = 0;
            auVar1051._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar260._8_8_ = 0;
            auVar260._0_8_ = local_1140;
            auVar753._8_8_ = 0;
            auVar753._0_8_ = local_1248.y.n[4];
            auVar261._8_8_ = 0;
            auVar261._0_8_ = local_1138;
            auVar754._8_8_ = 0;
            auVar754._0_8_ = local_1248.y.n[3];
            auVar262._8_8_ = 0;
            auVar262._0_8_ = local_1130;
            auVar755._8_8_ = 0;
            auVar755._0_8_ = local_1248.y.n[2];
            auVar263._8_8_ = 0;
            auVar263._0_8_ = local_1128;
            auVar756._8_8_ = 0;
            auVar756._0_8_ = local_1248.y.n[1];
            auVar264._8_8_ = 0;
            auVar264._0_8_ = local_1120;
            auVar757._8_8_ = 0;
            auVar757._0_8_ = local_1248.y.n[0];
            auVar265._8_8_ = 0;
            auVar265._0_8_ = uVar1153 >> 0x34 | SUB168(auVar258 * auVar752,8) << 0xc;
            auVar4 = auVar260 * auVar753 + auVar1051 + auVar261 * auVar754 + auVar262 * auVar755 +
                     auVar263 * auVar756 + auVar264 * auVar757 + auVar265 * ZEXT816(0x1000003d10);
            uVar1139 = auVar4._0_8_;
            auVar1052._8_8_ = 0;
            auVar1052._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar266._8_8_ = 0;
            auVar266._0_8_ = local_1140;
            auVar758._8_8_ = 0;
            auVar758._0_8_ = local_1248.y.n[0];
            auVar267._8_8_ = 0;
            auVar267._0_8_ = local_1138;
            auVar759._8_8_ = 0;
            auVar759._0_8_ = local_1248.y.n[4];
            auVar268._8_8_ = 0;
            auVar268._0_8_ = local_1130;
            auVar760._8_8_ = 0;
            auVar760._0_8_ = local_1248.y.n[3];
            auVar269._8_8_ = 0;
            auVar269._0_8_ = local_1128;
            auVar761._8_8_ = 0;
            auVar761._0_8_ = local_1248.y.n[2];
            auVar270._8_8_ = 0;
            auVar270._0_8_ = local_1120;
            auVar762._8_8_ = 0;
            auVar762._0_8_ = local_1248.y.n[1];
            auVar4 = auVar267 * auVar759 + auVar1052 + auVar268 * auVar760 + auVar269 * auVar761 +
                     auVar270 * auVar762;
            uVar1153 = auVar4._0_8_;
            auVar1054._8_8_ = 0;
            auVar1054._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar763._8_8_ = 0;
            auVar763._0_8_ =
                 (uVar1153 & 0xfffffffffffff) << 4 | (uVar1139 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar266 * auVar758 + ZEXT816(0x1000003d1) * auVar763;
            uVar1152 = auVar4._0_8_;
            uVar1153 = uVar1152 & 0xfffffffffffff;
            auVar1053._8_8_ = 0;
            auVar1053._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar271._8_8_ = 0;
            auVar271._0_8_ = local_1140;
            auVar764._8_8_ = 0;
            auVar764._0_8_ = local_1248.y.n[1];
            auVar272._8_8_ = 0;
            auVar272._0_8_ = local_1138;
            auVar765._8_8_ = 0;
            auVar765._0_8_ = local_1248.y.n[0];
            auVar273._8_8_ = 0;
            auVar273._0_8_ = local_1130;
            auVar766._8_8_ = 0;
            auVar766._0_8_ = local_1248.y.n[4];
            auVar274._8_8_ = 0;
            auVar274._0_8_ = local_1128;
            auVar767._8_8_ = 0;
            auVar767._0_8_ = local_1248.y.n[3];
            auVar275._8_8_ = 0;
            auVar275._0_8_ = local_1120;
            auVar768._8_8_ = 0;
            auVar768._0_8_ = local_1248.y.n[2];
            auVar5 = auVar273 * auVar766 + auVar1054 + auVar274 * auVar767 + auVar275 * auVar768;
            uVar1152 = auVar5._0_8_;
            auVar276._8_8_ = 0;
            auVar276._0_8_ = uVar1152 & 0xfffffffffffff;
            auVar4 = auVar271 * auVar764 + auVar1053 + auVar272 * auVar765 +
                     auVar276 * ZEXT816(0x1000003d10);
            uVar1154 = auVar4._0_8_;
            auVar1056._8_8_ = 0;
            auVar1056._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
            uVar1152 = uVar1154 & 0xfffffffffffff;
            auVar1055._8_8_ = 0;
            auVar1055._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar277._8_8_ = 0;
            auVar277._0_8_ = local_1140;
            auVar769._8_8_ = 0;
            auVar769._0_8_ = local_1248.y.n[2];
            auVar278._8_8_ = 0;
            auVar278._0_8_ = local_1138;
            auVar770._8_8_ = 0;
            auVar770._0_8_ = local_1248.y.n[1];
            auVar279._8_8_ = 0;
            auVar279._0_8_ = local_1130;
            auVar771._8_8_ = 0;
            auVar771._0_8_ = local_1248.y.n[0];
            auVar280._8_8_ = 0;
            auVar280._0_8_ = local_1128;
            auVar772._8_8_ = 0;
            auVar772._0_8_ = local_1248.y.n[4];
            auVar281._8_8_ = 0;
            auVar281._0_8_ = local_1120;
            auVar773._8_8_ = 0;
            auVar773._0_8_ = local_1248.y.n[3];
            auVar5 = auVar280 * auVar772 + auVar1056 + auVar281 * auVar773;
            uVar1163 = auVar5._0_8_;
            auVar282._8_8_ = 0;
            auVar282._0_8_ = uVar1163 & 0xfffffffffffff;
            auVar4 = auVar277 * auVar769 + auVar1055 + auVar278 * auVar770 + auVar279 * auVar771 +
                     auVar282 * ZEXT816(0x1000003d10);
            uVar1155 = auVar4._0_8_;
            uVar1154 = uVar1155 & 0xfffffffffffff;
            auVar1057._8_8_ = 0;
            auVar1057._0_8_ =
                 (uVar1155 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1138 & 0xfffffffffffff);
            auVar283._8_8_ = 0;
            auVar283._0_8_ = uVar1163 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1057 = auVar283 * ZEXT816(0x1000003d10) + auVar1057;
            uVar1163 = auVar1057._0_8_;
            uVar1138 = uVar1163 & 0xfffffffffffff;
            uVar1158 = (uVar1163 >> 0x34 | auVar1057._8_8_ << 0xc) + (uVar1139 & 0xffffffffffff);
            auVar284._8_8_ = 0;
            auVar284._0_8_ = local_10c8.x.n[0];
            auVar774._8_8_ = 0;
            auVar774._0_8_ = uVar1138;
            auVar285._8_8_ = 0;
            auVar285._0_8_ = local_10c8.x.n[1];
            auVar775._8_8_ = 0;
            auVar775._0_8_ = uVar1154;
            auVar286._8_8_ = 0;
            auVar286._0_8_ = local_10c8.x.n[2];
            auVar776._8_8_ = 0;
            auVar776._0_8_ = uVar1152;
            auVar287._8_8_ = 0;
            auVar287._0_8_ = local_10c8.x.n[3];
            auVar777._8_8_ = 0;
            auVar777._0_8_ = uVar1153;
            auVar288._8_8_ = 0;
            auVar288._0_8_ = local_10c8.x.n[4];
            auVar778._8_8_ = 0;
            auVar778._0_8_ = uVar1158;
            uVar1139 = SUB168(auVar288 * auVar778,0);
            auVar289._8_8_ = 0;
            auVar289._0_8_ = uVar1139 & 0xfffffffffffff;
            auVar4 = auVar285 * auVar775 + auVar284 * auVar774 + auVar286 * auVar776 +
                     auVar287 * auVar777 + auVar289 * ZEXT816(0x1000003d10);
            uVar1163 = auVar4._0_8_;
            auVar1058._8_8_ = 0;
            auVar1058._0_8_ = uVar1163 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar290._8_8_ = 0;
            auVar290._0_8_ = local_10c8.x.n[0];
            auVar779._8_8_ = 0;
            auVar779._0_8_ = uVar1158;
            auVar291._8_8_ = 0;
            auVar291._0_8_ = local_10c8.x.n[1];
            auVar780._8_8_ = 0;
            auVar780._0_8_ = uVar1138;
            auVar292._8_8_ = 0;
            auVar292._0_8_ = local_10c8.x.n[2];
            auVar781._8_8_ = 0;
            auVar781._0_8_ = uVar1154;
            auVar293._8_8_ = 0;
            auVar293._0_8_ = local_10c8.x.n[3];
            auVar782._8_8_ = 0;
            auVar782._0_8_ = uVar1152;
            auVar294._8_8_ = 0;
            auVar294._0_8_ = local_10c8.x.n[4];
            auVar783._8_8_ = 0;
            auVar783._0_8_ = uVar1153;
            auVar295._8_8_ = 0;
            auVar295._0_8_ = uVar1139 >> 0x34 | SUB168(auVar288 * auVar778,8) << 0xc;
            auVar4 = auVar290 * auVar779 + auVar1058 + auVar291 * auVar780 + auVar292 * auVar781 +
                     auVar293 * auVar782 + auVar294 * auVar783 + auVar295 * ZEXT816(0x1000003d10);
            uVar1139 = auVar4._0_8_;
            auVar1059._8_8_ = 0;
            auVar1059._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
            local_1118 = (uVar1139 & 0xfffffffffffff) >> 0x30;
            auVar296._8_8_ = 0;
            auVar296._0_8_ = local_10c8.x.n[0];
            auVar784._8_8_ = 0;
            auVar784._0_8_ = uVar1153;
            auVar297._8_8_ = 0;
            auVar297._0_8_ = local_10c8.x.n[1];
            auVar785._8_8_ = 0;
            auVar785._0_8_ = uVar1158;
            auVar298._8_8_ = 0;
            auVar298._0_8_ = local_10c8.x.n[2];
            auVar786._8_8_ = 0;
            auVar786._0_8_ = uVar1138;
            auVar299._8_8_ = 0;
            auVar299._0_8_ = local_10c8.x.n[3];
            auVar787._8_8_ = 0;
            auVar787._0_8_ = uVar1154;
            auVar300._8_8_ = 0;
            auVar300._0_8_ = local_10c8.x.n[4];
            auVar788._8_8_ = 0;
            auVar788._0_8_ = uVar1152;
            auVar4 = auVar297 * auVar785 + auVar1059 + auVar298 * auVar786 + auVar299 * auVar787 +
                     auVar300 * auVar788;
            uVar1155 = auVar4._0_8_;
            auVar1061._8_8_ = 0;
            auVar1061._0_8_ = uVar1155 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar789._8_8_ = 0;
            auVar789._0_8_ = (uVar1155 & 0xfffffffffffff) << 4 | local_1118;
            auVar4 = auVar296 * auVar784 + ZEXT816(0x1000003d1) * auVar789;
            uVar1155 = auVar4._0_8_;
            local_10f0 = uVar1155 & 0xfffffffffffff;
            auVar1060._8_8_ = 0;
            auVar1060._0_8_ = uVar1155 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar301._8_8_ = 0;
            auVar301._0_8_ = local_10c8.x.n[0];
            auVar790._8_8_ = 0;
            auVar790._0_8_ = uVar1152;
            auVar302._8_8_ = 0;
            auVar302._0_8_ = local_10c8.x.n[1];
            auVar791._8_8_ = 0;
            auVar791._0_8_ = uVar1153;
            auVar303._8_8_ = 0;
            auVar303._0_8_ = local_10c8.x.n[2];
            auVar792._8_8_ = 0;
            auVar792._0_8_ = uVar1158;
            auVar304._8_8_ = 0;
            auVar304._0_8_ = local_10c8.x.n[3];
            auVar793._8_8_ = 0;
            auVar793._0_8_ = uVar1138;
            auVar305._8_8_ = 0;
            auVar305._0_8_ = local_10c8.x.n[4];
            auVar794._8_8_ = 0;
            auVar794._0_8_ = uVar1154;
            auVar5 = auVar303 * auVar792 + auVar1061 + auVar304 * auVar793 + auVar305 * auVar794;
            uVar1155 = auVar5._0_8_;
            auVar306._8_8_ = 0;
            auVar306._0_8_ = uVar1155 & 0xfffffffffffff;
            auVar4 = auVar301 * auVar790 + auVar1060 + auVar302 * auVar791 +
                     auVar306 * ZEXT816(0x1000003d10);
            uVar1159 = auVar4._0_8_;
            auVar1063._8_8_ = 0;
            auVar1063._0_8_ = uVar1155 >> 0x34 | auVar5._8_8_ << 0xc;
            local_10e8 = uVar1159 & 0xfffffffffffff;
            auVar1062._8_8_ = 0;
            auVar1062._0_8_ = uVar1159 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar307._8_8_ = 0;
            auVar307._0_8_ = local_10c8.x.n[0];
            auVar795._8_8_ = 0;
            auVar795._0_8_ = uVar1154;
            auVar308._8_8_ = 0;
            auVar308._0_8_ = local_10c8.x.n[1];
            auVar796._8_8_ = 0;
            auVar796._0_8_ = uVar1152;
            auVar309._8_8_ = 0;
            auVar309._0_8_ = local_10c8.x.n[2];
            auVar797._8_8_ = 0;
            auVar797._0_8_ = uVar1153;
            auVar310._8_8_ = 0;
            auVar310._0_8_ = local_10c8.x.n[3];
            auVar798._8_8_ = 0;
            auVar798._0_8_ = uVar1158;
            auVar311._8_8_ = 0;
            auVar311._0_8_ = local_10c8.x.n[4];
            auVar799._8_8_ = 0;
            auVar799._0_8_ = uVar1138;
            auVar5 = auVar310 * auVar798 + auVar1063 + auVar311 * auVar799;
            uVar1153 = auVar5._0_8_;
            auVar312._8_8_ = 0;
            auVar312._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar307 * auVar795 + auVar1062 + auVar308 * auVar796 + auVar309 * auVar797 +
                     auVar312 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            local_10e0 = uVar1152 & 0xfffffffffffff;
            auVar1064._8_8_ = 0;
            auVar1064._0_8_ =
                 (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1163 & 0xfffffffffffff);
            auVar313._8_8_ = 0;
            auVar313._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1064 = auVar313 * ZEXT816(0x1000003d10) + auVar1064;
            uVar1153 = auVar1064._0_8_;
            local_10d8 = uVar1153 & 0xfffffffffffff;
            local_10d0 = (uVar1153 >> 0x34 | auVar1064._8_8_ << 0xc) + (uVar1139 & 0xffffffffffff);
            local_11a0.n[0] = (0x3ffffbfffff0bc - uVar1128) + local_11c8;
            local_11a0.n[1] = (0x3ffffffffffffc - uVar1140) + local_11c0;
            local_11a0.n[2] = (0x3ffffffffffffc - uVar1147) + local_11b8;
            local_11a0.n[3] = (0x3ffffffffffffc - uVar1150) + local_11b0;
            local_11a0.n[4] = (0x3fffffffffffc - uVar1156) + local_11a8;
            local_1278.n[0] = (0x3ffffbfffff0bc - uVar1131) + local_10f0;
            local_1278.n[1] = (0x3ffffffffffffc - uVar1141) + local_10e8;
            local_1278.n[2] = (0x3ffffffffffffc - uVar1148) + local_10e0;
            local_1278.n[3] = (0x3ffffffffffffc - uVar1151) + local_10d8;
            local_1278.n[4] = (0x3fffffffffffc - uVar1157) + local_10d0;
            iVar1127 = secp256k1_fe_normalizes_to_zero_var(&local_11a0);
            if (iVar1127 == 0) {
              auVar314._8_8_ = 0;
              auVar314._0_8_ = local_1278.n[0] * 2;
              auVar800._8_8_ = 0;
              auVar800._0_8_ = local_1278.n[3];
              auVar315._8_8_ = 0;
              auVar315._0_8_ = local_1278.n[1] * 2;
              auVar801._8_8_ = 0;
              auVar801._0_8_ = local_1278.n[2];
              auVar316._8_8_ = 0;
              auVar316._0_8_ = local_1278.n[4];
              auVar802._8_8_ = 0;
              auVar802._0_8_ = local_1278.n[4];
              uVar1152 = SUB168(auVar316 * auVar802,0);
              auVar317._8_8_ = 0;
              auVar317._0_8_ = uVar1152 & 0xfffffffffffff;
              auVar4 = auVar315 * auVar801 + auVar314 * auVar800 + auVar317 * ZEXT816(0x1000003d10);
              uVar1154 = auVar4._0_8_;
              auVar1065._8_8_ = 0;
              auVar1065._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              uVar1153 = local_1278.n[4] * 2;
              auVar318._8_8_ = 0;
              auVar318._0_8_ = local_1278.n[0];
              auVar803._8_8_ = 0;
              auVar803._0_8_ = uVar1153;
              auVar319._8_8_ = 0;
              auVar319._0_8_ = local_1278.n[1] * 2;
              auVar804._8_8_ = 0;
              auVar804._0_8_ = local_1278.n[3];
              auVar320._8_8_ = 0;
              auVar320._0_8_ = local_1278.n[2];
              auVar805._8_8_ = 0;
              auVar805._0_8_ = local_1278.n[2];
              auVar321._8_8_ = 0;
              auVar321._0_8_ = uVar1152 >> 0x34 | SUB168(auVar316 * auVar802,8) << 0xc;
              auVar4 = auVar318 * auVar803 + auVar1065 + auVar319 * auVar804 + auVar320 * auVar805 +
                       auVar321 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              auVar1066._8_8_ = 0;
              auVar1066._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar322._8_8_ = 0;
              auVar322._0_8_ = local_1278.n[0];
              auVar806._8_8_ = 0;
              auVar806._0_8_ = local_1278.n[0];
              auVar323._8_8_ = 0;
              auVar323._0_8_ = local_1278.n[1];
              auVar807._8_8_ = 0;
              auVar807._0_8_ = uVar1153;
              auVar324._8_8_ = 0;
              auVar324._0_8_ = local_1278.n[2] * 2;
              auVar808._8_8_ = 0;
              auVar808._0_8_ = local_1278.n[3];
              auVar4 = auVar323 * auVar807 + auVar1066 + auVar324 * auVar808;
              uVar1138 = auVar4._0_8_;
              auVar1068._8_8_ = 0;
              auVar1068._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar809._8_8_ = 0;
              auVar809._0_8_ =
                   (uVar1138 & 0xfffffffffffff) << 4 | (uVar1152 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar322 * auVar806 + ZEXT816(0x1000003d1) * auVar809;
              uVar1138 = auVar4._0_8_;
              local_1118 = uVar1138 & 0xfffffffffffff;
              auVar1067._8_8_ = 0;
              auVar1067._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar325._8_8_ = 0;
              auVar325._0_8_ = local_1278.n[0] * 2;
              auVar810._8_8_ = 0;
              auVar810._0_8_ = local_1278.n[1];
              auVar326._8_8_ = 0;
              auVar326._0_8_ = local_1278.n[2];
              auVar811._8_8_ = 0;
              auVar811._0_8_ = uVar1153;
              auVar327._8_8_ = 0;
              auVar327._0_8_ = local_1278.n[3];
              auVar812._8_8_ = 0;
              auVar812._0_8_ = local_1278.n[3];
              auVar5 = auVar326 * auVar811 + auVar1068 + auVar327 * auVar812;
              uVar1138 = auVar5._0_8_;
              auVar328._8_8_ = 0;
              auVar328._0_8_ = uVar1138 & 0xfffffffffffff;
              auVar4 = auVar325 * auVar810 + auVar1067 + auVar328 * ZEXT816(0x1000003d10);
              uVar1139 = auVar4._0_8_;
              auVar1070._8_8_ = 0;
              auVar1070._0_8_ = uVar1138 >> 0x34 | auVar5._8_8_ << 0xc;
              local_1110 = uVar1139 & 0xfffffffffffff;
              auVar1069._8_8_ = 0;
              auVar1069._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar329._8_8_ = 0;
              auVar329._0_8_ = local_1278.n[0] * 2;
              auVar813._8_8_ = 0;
              auVar813._0_8_ = local_1278.n[2];
              auVar330._8_8_ = 0;
              auVar330._0_8_ = local_1278.n[1];
              auVar814._8_8_ = 0;
              auVar814._0_8_ = local_1278.n[1];
              auVar331._8_8_ = 0;
              auVar331._0_8_ = local_1278.n[3];
              auVar815._8_8_ = 0;
              auVar815._0_8_ = uVar1153;
              auVar1070 = auVar331 * auVar815 + auVar1070;
              uVar1153 = auVar1070._0_8_;
              auVar332._8_8_ = 0;
              auVar332._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar329 * auVar813 + auVar1069 + auVar330 * auVar814 +
                       auVar332 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              local_1108 = uVar1138 & 0xfffffffffffff;
              auVar1071._8_8_ = 0;
              auVar1071._0_8_ =
                   (uVar1138 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1154 & 0xfffffffffffff);
              auVar333._8_8_ = 0;
              auVar333._0_8_ = uVar1153 >> 0x34 | auVar1070._8_8_ << 0xc;
              auVar1071 = auVar333 * ZEXT816(0x1000003d10) + auVar1071;
              uVar1153 = auVar1071._0_8_;
              local_1100 = uVar1153 & 0xfffffffffffff;
              local_10f8 = (uVar1153 >> 0x34 | auVar1071._8_8_ << 0xc) + (uVar1152 & 0xffffffffffff)
              ;
              auVar334._8_8_ = 0;
              auVar334._0_8_ = local_11a0.n[0] * 2;
              auVar816._8_8_ = 0;
              auVar816._0_8_ = local_11a0.n[3];
              auVar335._8_8_ = 0;
              auVar335._0_8_ = local_11a0.n[1] * 2;
              auVar817._8_8_ = 0;
              auVar817._0_8_ = local_11a0.n[2];
              auVar336._8_8_ = 0;
              auVar336._0_8_ = local_11a0.n[4];
              auVar818._8_8_ = 0;
              auVar818._0_8_ = local_11a0.n[4];
              uVar1152 = SUB168(auVar336 * auVar818,0);
              auVar337._8_8_ = 0;
              auVar337._0_8_ = uVar1152 & 0xfffffffffffff;
              auVar4 = auVar335 * auVar817 + auVar334 * auVar816 + auVar337 * ZEXT816(0x1000003d10);
              uVar1154 = auVar4._0_8_;
              auVar1072._8_8_ = 0;
              auVar1072._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              uVar1153 = local_11a0.n[4] * 2;
              auVar338._8_8_ = 0;
              auVar338._0_8_ = local_11a0.n[0];
              auVar819._8_8_ = 0;
              auVar819._0_8_ = uVar1153;
              auVar339._8_8_ = 0;
              auVar339._0_8_ = local_11a0.n[1] * 2;
              auVar820._8_8_ = 0;
              auVar820._0_8_ = local_11a0.n[3];
              auVar340._8_8_ = 0;
              auVar340._0_8_ = local_11a0.n[2];
              auVar821._8_8_ = 0;
              auVar821._0_8_ = local_11a0.n[2];
              auVar341._8_8_ = 0;
              auVar341._0_8_ = uVar1152 >> 0x34 | SUB168(auVar336 * auVar818,8) << 0xc;
              auVar4 = auVar338 * auVar819 + auVar1072 + auVar339 * auVar820 + auVar340 * auVar821 +
                       auVar341 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              auVar1073._8_8_ = 0;
              auVar1073._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar342._8_8_ = 0;
              auVar342._0_8_ = local_11a0.n[0];
              auVar822._8_8_ = 0;
              auVar822._0_8_ = local_11a0.n[0];
              auVar343._8_8_ = 0;
              auVar343._0_8_ = local_11a0.n[1];
              auVar823._8_8_ = 0;
              auVar823._0_8_ = uVar1153;
              auVar344._8_8_ = 0;
              auVar344._0_8_ = local_11a0.n[2] * 2;
              auVar824._8_8_ = 0;
              auVar824._0_8_ = local_11a0.n[3];
              auVar4 = auVar343 * auVar823 + auVar1073 + auVar344 * auVar824;
              uVar1138 = auVar4._0_8_;
              auVar1075._8_8_ = 0;
              auVar1075._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar825._8_8_ = 0;
              auVar825._0_8_ =
                   (uVar1138 & 0xfffffffffffff) << 4 | (uVar1152 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar342 * auVar822 + ZEXT816(0x1000003d1) * auVar825;
              uVar1138 = auVar4._0_8_;
              local_1070 = uVar1138 & 0xfffffffffffff;
              auVar1074._8_8_ = 0;
              auVar1074._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar345._8_8_ = 0;
              auVar345._0_8_ = local_11a0.n[0] * 2;
              auVar826._8_8_ = 0;
              auVar826._0_8_ = local_11a0.n[1];
              auVar346._8_8_ = 0;
              auVar346._0_8_ = local_11a0.n[2];
              auVar827._8_8_ = 0;
              auVar827._0_8_ = uVar1153;
              auVar347._8_8_ = 0;
              auVar347._0_8_ = local_11a0.n[3];
              auVar828._8_8_ = 0;
              auVar828._0_8_ = local_11a0.n[3];
              auVar5 = auVar346 * auVar827 + auVar1075 + auVar347 * auVar828;
              uVar1138 = auVar5._0_8_;
              auVar348._8_8_ = 0;
              auVar348._0_8_ = uVar1138 & 0xfffffffffffff;
              auVar4 = auVar345 * auVar826 + auVar1074 + auVar348 * ZEXT816(0x1000003d10);
              uVar1139 = auVar4._0_8_;
              auVar1077._8_8_ = 0;
              auVar1077._0_8_ = uVar1138 >> 0x34 | auVar5._8_8_ << 0xc;
              local_1068 = uVar1139 & 0xfffffffffffff;
              auVar1076._8_8_ = 0;
              auVar1076._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar349._8_8_ = 0;
              auVar349._0_8_ = local_11a0.n[0] * 2;
              auVar829._8_8_ = 0;
              auVar829._0_8_ = local_11a0.n[2];
              auVar350._8_8_ = 0;
              auVar350._0_8_ = local_11a0.n[1];
              auVar830._8_8_ = 0;
              auVar830._0_8_ = local_11a0.n[1];
              auVar351._8_8_ = 0;
              auVar351._0_8_ = local_11a0.n[3];
              auVar831._8_8_ = 0;
              auVar831._0_8_ = uVar1153;
              auVar1077 = auVar351 * auVar831 + auVar1077;
              uVar1153 = auVar1077._0_8_;
              auVar352._8_8_ = 0;
              auVar352._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar349 * auVar829 + auVar1076 + auVar350 * auVar830 +
                       auVar352 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              local_1060 = uVar1138 & 0xfffffffffffff;
              auVar1078._8_8_ = 0;
              auVar1078._0_8_ =
                   (uVar1138 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1154 & 0xfffffffffffff);
              auVar353._8_8_ = 0;
              auVar353._0_8_ = uVar1153 >> 0x34 | auVar1077._8_8_ << 0xc;
              auVar1078 = auVar353 * ZEXT816(0x1000003d10) + auVar1078;
              uVar1153 = auVar1078._0_8_;
              local_1058 = uVar1153 & 0xfffffffffffff;
              local_1050 = (uVar1153 >> 0x34 | auVar1078._8_8_ << 0xc) + (uVar1152 & 0xffffffffffff)
              ;
              auVar354._8_8_ = 0;
              auVar354._0_8_ = local_1070;
              auVar832._8_8_ = 0;
              auVar832._0_8_ = local_11a0.n[3];
              auVar355._8_8_ = 0;
              auVar355._0_8_ = local_1068;
              auVar833._8_8_ = 0;
              auVar833._0_8_ = local_11a0.n[2];
              auVar356._8_8_ = 0;
              auVar356._0_8_ = local_1060;
              auVar834._8_8_ = 0;
              auVar834._0_8_ = local_11a0.n[1];
              auVar357._8_8_ = 0;
              auVar357._0_8_ = local_1058;
              auVar835._8_8_ = 0;
              auVar835._0_8_ = local_11a0.n[0];
              auVar358._8_8_ = 0;
              auVar358._0_8_ = local_1050;
              auVar836._8_8_ = 0;
              auVar836._0_8_ = local_11a0.n[4];
              uVar1153 = SUB168(auVar358 * auVar836,0);
              auVar359._8_8_ = 0;
              auVar359._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar355 * auVar833 + auVar354 * auVar832 + auVar356 * auVar834 +
                       auVar357 * auVar835 + auVar359 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              auVar1079._8_8_ = 0;
              auVar1079._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar360._8_8_ = 0;
              auVar360._0_8_ = local_1070;
              auVar837._8_8_ = 0;
              auVar837._0_8_ = local_11a0.n[4];
              auVar361._8_8_ = 0;
              auVar361._0_8_ = local_1068;
              auVar838._8_8_ = 0;
              auVar838._0_8_ = local_11a0.n[3];
              auVar362._8_8_ = 0;
              auVar362._0_8_ = local_1060;
              auVar839._8_8_ = 0;
              auVar839._0_8_ = local_11a0.n[2];
              auVar363._8_8_ = 0;
              auVar363._0_8_ = local_1058;
              auVar840._8_8_ = 0;
              auVar840._0_8_ = local_11a0.n[1];
              auVar364._8_8_ = 0;
              auVar364._0_8_ = local_1050;
              auVar841._8_8_ = 0;
              auVar841._0_8_ = local_11a0.n[0];
              auVar365._8_8_ = 0;
              auVar365._0_8_ = uVar1153 >> 0x34 | SUB168(auVar358 * auVar836,8) << 0xc;
              auVar4 = auVar360 * auVar837 + auVar1079 + auVar361 * auVar838 + auVar362 * auVar839 +
                       auVar363 * auVar840 + auVar364 * auVar841 + auVar365 * ZEXT816(0x1000003d10);
              uVar1153 = auVar4._0_8_;
              auVar1080._8_8_ = 0;
              auVar1080._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar366._8_8_ = 0;
              auVar366._0_8_ = local_1070;
              auVar842._8_8_ = 0;
              auVar842._0_8_ = local_11a0.n[0];
              auVar367._8_8_ = 0;
              auVar367._0_8_ = local_1068;
              auVar843._8_8_ = 0;
              auVar843._0_8_ = local_11a0.n[4];
              auVar368._8_8_ = 0;
              auVar368._0_8_ = local_1060;
              auVar844._8_8_ = 0;
              auVar844._0_8_ = local_11a0.n[3];
              auVar369._8_8_ = 0;
              auVar369._0_8_ = local_1058;
              auVar845._8_8_ = 0;
              auVar845._0_8_ = local_11a0.n[2];
              auVar370._8_8_ = 0;
              auVar370._0_8_ = local_1050;
              auVar846._8_8_ = 0;
              auVar846._0_8_ = local_11a0.n[1];
              auVar4 = auVar367 * auVar843 + auVar1080 + auVar368 * auVar844 + auVar369 * auVar845 +
                       auVar370 * auVar846;
              uVar1154 = auVar4._0_8_;
              auVar1082._8_8_ = 0;
              auVar1082._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar847._8_8_ = 0;
              auVar847._0_8_ =
                   (uVar1154 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar366 * auVar842 + ZEXT816(0x1000003d1) * auVar847;
              uVar1154 = auVar4._0_8_;
              uVar1163 = uVar1154 & 0xfffffffffffff;
              auVar1081._8_8_ = 0;
              auVar1081._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar371._8_8_ = 0;
              auVar371._0_8_ = local_1070;
              auVar848._8_8_ = 0;
              auVar848._0_8_ = local_11a0.n[1];
              auVar372._8_8_ = 0;
              auVar372._0_8_ = local_1068;
              auVar849._8_8_ = 0;
              auVar849._0_8_ = local_11a0.n[0];
              auVar373._8_8_ = 0;
              auVar373._0_8_ = local_1060;
              auVar850._8_8_ = 0;
              auVar850._0_8_ = local_11a0.n[4];
              auVar374._8_8_ = 0;
              auVar374._0_8_ = local_1058;
              auVar851._8_8_ = 0;
              auVar851._0_8_ = local_11a0.n[3];
              auVar375._8_8_ = 0;
              auVar375._0_8_ = local_1050;
              auVar852._8_8_ = 0;
              auVar852._0_8_ = local_11a0.n[2];
              auVar5 = auVar373 * auVar850 + auVar1082 + auVar374 * auVar851 + auVar375 * auVar852;
              uVar1154 = auVar5._0_8_;
              auVar376._8_8_ = 0;
              auVar376._0_8_ = uVar1154 & 0xfffffffffffff;
              auVar4 = auVar371 * auVar848 + auVar1081 + auVar372 * auVar849 +
                       auVar376 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              auVar1084._8_8_ = 0;
              auVar1084._0_8_ = uVar1154 >> 0x34 | auVar5._8_8_ << 0xc;
              uVar1155 = uVar1138 & 0xfffffffffffff;
              auVar1083._8_8_ = 0;
              auVar1083._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar377._8_8_ = 0;
              auVar377._0_8_ = local_1070;
              auVar853._8_8_ = 0;
              auVar853._0_8_ = local_11a0.n[2];
              auVar378._8_8_ = 0;
              auVar378._0_8_ = local_1068;
              auVar854._8_8_ = 0;
              auVar854._0_8_ = local_11a0.n[1];
              auVar379._8_8_ = 0;
              auVar379._0_8_ = local_1060;
              auVar855._8_8_ = 0;
              auVar855._0_8_ = local_11a0.n[0];
              auVar380._8_8_ = 0;
              auVar380._0_8_ = local_1058;
              auVar856._8_8_ = 0;
              auVar856._0_8_ = local_11a0.n[4];
              auVar381._8_8_ = 0;
              auVar381._0_8_ = local_1050;
              auVar857._8_8_ = 0;
              auVar857._0_8_ = local_11a0.n[3];
              auVar5 = auVar380 * auVar856 + auVar1084 + auVar381 * auVar857;
              uVar1154 = auVar5._0_8_;
              auVar382._8_8_ = 0;
              auVar382._0_8_ = uVar1154 & 0xfffffffffffff;
              auVar4 = auVar377 * auVar853 + auVar1083 + auVar378 * auVar854 + auVar379 * auVar855 +
                       auVar382 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              uVar1158 = uVar1138 & 0xfffffffffffff;
              auVar1085._8_8_ = 0;
              auVar1085._0_8_ =
                   (uVar1138 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1152 & 0xfffffffffffff);
              auVar383._8_8_ = 0;
              auVar383._0_8_ = uVar1154 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1085 = auVar383 * ZEXT816(0x1000003d10) + auVar1085;
              uVar1152 = auVar1085._0_8_;
              uVar1159 = uVar1152 & 0xfffffffffffff;
              uVar1160 = (uVar1152 >> 0x34 | auVar1085._8_8_ << 0xc) + (uVar1153 & 0xffffffffffff);
              uVar1153 = psVar1->n[0];
              uVar1152 = (r->z).n[1];
              uVar1154 = (r->z).n[2];
              uVar1138 = (r->z).n[3];
              uVar1139 = (r->z).n[4];
              auVar384._8_8_ = 0;
              auVar384._0_8_ = local_11a0.n[0];
              auVar858._8_8_ = 0;
              auVar858._0_8_ = uVar1138;
              auVar385._8_8_ = 0;
              auVar385._0_8_ = local_11a0.n[1];
              auVar859._8_8_ = 0;
              auVar859._0_8_ = uVar1154;
              auVar386._8_8_ = 0;
              auVar386._0_8_ = local_11a0.n[2];
              auVar860._8_8_ = 0;
              auVar860._0_8_ = uVar1152;
              auVar387._8_8_ = 0;
              auVar387._0_8_ = local_11a0.n[3];
              auVar861._8_8_ = 0;
              auVar861._0_8_ = uVar1153;
              auVar388._8_8_ = 0;
              auVar388._0_8_ = local_11a0.n[4];
              auVar862._8_8_ = 0;
              auVar862._0_8_ = uVar1139;
              uVar1129 = SUB168(auVar388 * auVar862,0);
              auVar389._8_8_ = 0;
              auVar389._0_8_ = uVar1129 & 0xfffffffffffff;
              auVar4 = auVar385 * auVar859 + auVar384 * auVar858 + auVar386 * auVar860 +
                       auVar387 * auVar861 + auVar389 * ZEXT816(0x1000003d10);
              uVar1135 = auVar4._0_8_;
              auVar1086._8_8_ = 0;
              auVar1086._0_8_ = uVar1135 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar390._8_8_ = 0;
              auVar390._0_8_ = local_11a0.n[0];
              auVar863._8_8_ = 0;
              auVar863._0_8_ = uVar1139;
              auVar391._8_8_ = 0;
              auVar391._0_8_ = local_11a0.n[1];
              auVar864._8_8_ = 0;
              auVar864._0_8_ = uVar1138;
              auVar392._8_8_ = 0;
              auVar392._0_8_ = local_11a0.n[2];
              auVar865._8_8_ = 0;
              auVar865._0_8_ = uVar1154;
              auVar393._8_8_ = 0;
              auVar393._0_8_ = local_11a0.n[3];
              auVar866._8_8_ = 0;
              auVar866._0_8_ = uVar1152;
              auVar394._8_8_ = 0;
              auVar394._0_8_ = local_11a0.n[4];
              auVar867._8_8_ = 0;
              auVar867._0_8_ = uVar1153;
              auVar395._8_8_ = 0;
              auVar395._0_8_ = uVar1129 >> 0x34 | SUB168(auVar388 * auVar862,8) << 0xc;
              auVar4 = auVar390 * auVar863 + auVar1086 + auVar391 * auVar864 + auVar392 * auVar865 +
                       auVar393 * auVar866 + auVar394 * auVar867 + auVar395 * ZEXT816(0x1000003d10);
              uVar1129 = auVar4._0_8_;
              auVar1087._8_8_ = 0;
              auVar1087._0_8_ = uVar1129 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar396._8_8_ = 0;
              auVar396._0_8_ = local_11a0.n[0];
              auVar868._8_8_ = 0;
              auVar868._0_8_ = uVar1153;
              auVar397._8_8_ = 0;
              auVar397._0_8_ = local_11a0.n[1];
              auVar869._8_8_ = 0;
              auVar869._0_8_ = uVar1139;
              auVar398._8_8_ = 0;
              auVar398._0_8_ = local_11a0.n[2];
              auVar870._8_8_ = 0;
              auVar870._0_8_ = uVar1138;
              auVar399._8_8_ = 0;
              auVar399._0_8_ = local_11a0.n[3];
              auVar871._8_8_ = 0;
              auVar871._0_8_ = uVar1154;
              auVar400._8_8_ = 0;
              auVar400._0_8_ = local_11a0.n[4];
              auVar872._8_8_ = 0;
              auVar872._0_8_ = uVar1152;
              auVar4 = auVar397 * auVar869 + auVar1087 + auVar398 * auVar870 + auVar399 * auVar871 +
                       auVar400 * auVar872;
              uVar1136 = auVar4._0_8_;
              auVar1089._8_8_ = 0;
              auVar1089._0_8_ = uVar1136 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar873._8_8_ = 0;
              auVar873._0_8_ =
                   (uVar1136 & 0xfffffffffffff) << 4 | (uVar1129 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar396 * auVar868 + ZEXT816(0x1000003d1) * auVar873;
              uVar1136 = auVar4._0_8_;
              psVar1->n[0] = uVar1136 & 0xfffffffffffff;
              auVar1088._8_8_ = 0;
              auVar1088._0_8_ = uVar1136 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar401._8_8_ = 0;
              auVar401._0_8_ = local_11a0.n[0];
              auVar874._8_8_ = 0;
              auVar874._0_8_ = uVar1152;
              auVar402._8_8_ = 0;
              auVar402._0_8_ = local_11a0.n[1];
              auVar875._8_8_ = 0;
              auVar875._0_8_ = uVar1153;
              auVar403._8_8_ = 0;
              auVar403._0_8_ = local_11a0.n[2];
              auVar876._8_8_ = 0;
              auVar876._0_8_ = uVar1139;
              auVar404._8_8_ = 0;
              auVar404._0_8_ = local_11a0.n[3];
              auVar877._8_8_ = 0;
              auVar877._0_8_ = uVar1138;
              auVar405._8_8_ = 0;
              auVar405._0_8_ = local_11a0.n[4];
              auVar878._8_8_ = 0;
              auVar878._0_8_ = uVar1154;
              auVar5 = auVar403 * auVar876 + auVar1089 + auVar404 * auVar877 + auVar405 * auVar878;
              uVar1136 = auVar5._0_8_;
              auVar406._8_8_ = 0;
              auVar406._0_8_ = uVar1136 & 0xfffffffffffff;
              auVar4 = auVar401 * auVar874 + auVar1088 + auVar402 * auVar875 +
                       auVar406 * ZEXT816(0x1000003d10);
              uVar1161 = auVar4._0_8_;
              auVar1091._8_8_ = 0;
              auVar1091._0_8_ = uVar1136 >> 0x34 | auVar5._8_8_ << 0xc;
              (r->z).n[1] = uVar1161 & 0xfffffffffffff;
              auVar1090._8_8_ = 0;
              auVar1090._0_8_ = uVar1161 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar407._8_8_ = 0;
              auVar407._0_8_ = local_11a0.n[0];
              auVar879._8_8_ = 0;
              auVar879._0_8_ = uVar1154;
              auVar408._8_8_ = 0;
              auVar408._0_8_ = local_11a0.n[1];
              auVar880._8_8_ = 0;
              auVar880._0_8_ = uVar1152;
              auVar409._8_8_ = 0;
              auVar409._0_8_ = local_11a0.n[2];
              auVar881._8_8_ = 0;
              auVar881._0_8_ = uVar1153;
              auVar410._8_8_ = 0;
              auVar410._0_8_ = local_11a0.n[3];
              auVar882._8_8_ = 0;
              auVar882._0_8_ = uVar1139;
              auVar411._8_8_ = 0;
              auVar411._0_8_ = local_11a0.n[4];
              auVar883._8_8_ = 0;
              auVar883._0_8_ = uVar1138;
              auVar5 = auVar410 * auVar882 + auVar1091 + auVar411 * auVar883;
              uVar1153 = auVar5._0_8_;
              auVar412._8_8_ = 0;
              auVar412._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar407 * auVar879 + auVar1090 + auVar408 * auVar880 + auVar409 * auVar881 +
                       auVar412 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              (r->z).n[2] = uVar1152 & 0xfffffffffffff;
              auVar1092._8_8_ = 0;
              auVar1092._0_8_ =
                   (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1135 & 0xfffffffffffff);
              auVar413._8_8_ = 0;
              auVar413._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1092 = auVar413 * ZEXT816(0x1000003d10) + auVar1092;
              uVar1153 = auVar1092._0_8_;
              (r->z).n[3] = uVar1153 & 0xfffffffffffff;
              (r->z).n[4] = (uVar1153 >> 0x34 | auVar1092._8_8_ << 0xc) +
                            (uVar1129 & 0xffffffffffff);
              auVar414._8_8_ = 0;
              auVar414._0_8_ = local_1070;
              auVar884._8_8_ = 0;
              auVar884._0_8_ = uVar1150;
              auVar415._8_8_ = 0;
              auVar415._0_8_ = local_1068;
              auVar885._8_8_ = 0;
              auVar885._0_8_ = uVar1147;
              auVar416._8_8_ = 0;
              auVar416._0_8_ = local_1060;
              auVar886._8_8_ = 0;
              auVar886._0_8_ = uVar1140;
              auVar417._8_8_ = 0;
              auVar417._0_8_ = local_1058;
              auVar887._8_8_ = 0;
              auVar887._0_8_ = uVar1128;
              auVar418._8_8_ = 0;
              auVar418._0_8_ = local_1050;
              auVar888._8_8_ = 0;
              auVar888._0_8_ = uVar1156;
              uVar1153 = SUB168(auVar418 * auVar888,0);
              auVar419._8_8_ = 0;
              auVar419._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar415 * auVar885 + auVar414 * auVar884 + auVar416 * auVar886 +
                       auVar417 * auVar887 + auVar419 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              auVar1093._8_8_ = 0;
              auVar1093._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar420._8_8_ = 0;
              auVar420._0_8_ = local_1070;
              auVar889._8_8_ = 0;
              auVar889._0_8_ = uVar1156;
              auVar421._8_8_ = 0;
              auVar421._0_8_ = local_1068;
              auVar890._8_8_ = 0;
              auVar890._0_8_ = uVar1150;
              auVar422._8_8_ = 0;
              auVar422._0_8_ = local_1060;
              auVar891._8_8_ = 0;
              auVar891._0_8_ = uVar1147;
              auVar423._8_8_ = 0;
              auVar423._0_8_ = local_1058;
              auVar892._8_8_ = 0;
              auVar892._0_8_ = uVar1140;
              auVar424._8_8_ = 0;
              auVar424._0_8_ = local_1050;
              auVar893._8_8_ = 0;
              auVar893._0_8_ = uVar1128;
              auVar425._8_8_ = 0;
              auVar425._0_8_ = uVar1153 >> 0x34 | SUB168(auVar418 * auVar888,8) << 0xc;
              auVar4 = auVar420 * auVar889 + auVar1093 + auVar421 * auVar890 + auVar422 * auVar891 +
                       auVar423 * auVar892 + auVar424 * auVar893 + auVar425 * ZEXT816(0x1000003d10);
              uVar1153 = auVar4._0_8_;
              auVar1094._8_8_ = 0;
              auVar1094._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar426._8_8_ = 0;
              auVar426._0_8_ = local_1070;
              auVar894._8_8_ = 0;
              auVar894._0_8_ = uVar1128;
              auVar427._8_8_ = 0;
              auVar427._0_8_ = local_1068;
              auVar895._8_8_ = 0;
              auVar895._0_8_ = uVar1156;
              auVar428._8_8_ = 0;
              auVar428._0_8_ = local_1060;
              auVar896._8_8_ = 0;
              auVar896._0_8_ = uVar1150;
              auVar429._8_8_ = 0;
              auVar429._0_8_ = local_1058;
              auVar897._8_8_ = 0;
              auVar897._0_8_ = uVar1147;
              auVar430._8_8_ = 0;
              auVar430._0_8_ = local_1050;
              auVar898._8_8_ = 0;
              auVar898._0_8_ = uVar1140;
              auVar4 = auVar427 * auVar895 + auVar1094 + auVar428 * auVar896 + auVar429 * auVar897 +
                       auVar430 * auVar898;
              uVar1154 = auVar4._0_8_;
              auVar1096._8_8_ = 0;
              auVar1096._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar899._8_8_ = 0;
              auVar899._0_8_ =
                   (uVar1154 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar426 * auVar894 + ZEXT816(0x1000003d1) * auVar899;
              uVar1154 = auVar4._0_8_;
              local_11f0 = uVar1154 & 0xfffffffffffff;
              auVar1095._8_8_ = 0;
              auVar1095._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar431._8_8_ = 0;
              auVar431._0_8_ = local_1070;
              auVar900._8_8_ = 0;
              auVar900._0_8_ = uVar1140;
              auVar432._8_8_ = 0;
              auVar432._0_8_ = local_1068;
              auVar901._8_8_ = 0;
              auVar901._0_8_ = uVar1128;
              auVar433._8_8_ = 0;
              auVar433._0_8_ = local_1060;
              auVar902._8_8_ = 0;
              auVar902._0_8_ = uVar1156;
              auVar434._8_8_ = 0;
              auVar434._0_8_ = local_1058;
              auVar903._8_8_ = 0;
              auVar903._0_8_ = uVar1150;
              auVar435._8_8_ = 0;
              auVar435._0_8_ = local_1050;
              auVar904._8_8_ = 0;
              auVar904._0_8_ = uVar1147;
              auVar5 = auVar433 * auVar902 + auVar1096 + auVar434 * auVar903 + auVar435 * auVar904;
              uVar1154 = auVar5._0_8_;
              auVar436._8_8_ = 0;
              auVar436._0_8_ = uVar1154 & 0xfffffffffffff;
              auVar4 = auVar431 * auVar900 + auVar1095 + auVar432 * auVar901 +
                       auVar436 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              auVar1098._8_8_ = 0;
              auVar1098._0_8_ = uVar1154 >> 0x34 | auVar5._8_8_ << 0xc;
              uStack_11e8 = uVar1138 & 0xfffffffffffff;
              auVar1097._8_8_ = 0;
              auVar1097._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar437._8_8_ = 0;
              auVar437._0_8_ = local_1070;
              auVar905._8_8_ = 0;
              auVar905._0_8_ = uVar1147;
              auVar438._8_8_ = 0;
              auVar438._0_8_ = local_1068;
              auVar906._8_8_ = 0;
              auVar906._0_8_ = uVar1140;
              auVar439._8_8_ = 0;
              auVar439._0_8_ = local_1060;
              auVar907._8_8_ = 0;
              auVar907._0_8_ = uVar1128;
              auVar440._8_8_ = 0;
              auVar440._0_8_ = local_1058;
              auVar908._8_8_ = 0;
              auVar908._0_8_ = uVar1156;
              auVar441._8_8_ = 0;
              auVar441._0_8_ = local_1050;
              auVar909._8_8_ = 0;
              auVar909._0_8_ = uVar1150;
              auVar5 = auVar440 * auVar908 + auVar1098 + auVar441 * auVar909;
              uVar1128 = auVar5._0_8_;
              auVar442._8_8_ = 0;
              auVar442._0_8_ = uVar1128 & 0xfffffffffffff;
              auVar4 = auVar437 * auVar905 + auVar1097 + auVar438 * auVar906 + auVar439 * auVar907 +
                       auVar442 * ZEXT816(0x1000003d10);
              uVar1154 = auVar4._0_8_;
              local_11e0 = uVar1154 & 0xfffffffffffff;
              auVar1099._8_8_ = 0;
              auVar1099._0_8_ =
                   (uVar1154 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1152 & 0xfffffffffffff);
              auVar443._8_8_ = 0;
              auVar443._0_8_ = uVar1128 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1099 = auVar443 * ZEXT816(0x1000003d10) + auVar1099;
              uVar1128 = auVar1099._0_8_;
              uStack_11d8 = uVar1128 & 0xfffffffffffff;
              local_11d0 = (uVar1128 >> 0x34 | auVar1099._8_8_ << 0xc) + (uVar1153 & 0xffffffffffff)
              ;
              (r->x).n[0] = local_11f0;
              (r->x).n[1] = uStack_11e8;
              (r->x).n[2] = local_11e0;
              (r->x).n[3] = uStack_11d8;
              (r->x).n[4] = local_11d0;
              uVar1137 = (r->x).n[1];
              uVar1142 = (r->x).n[0] * 2;
              (r->x).n[0] = uVar1142;
              uVar1137 = uVar1137 * 2;
              (r->x).n[1] = uVar1137;
              uVar1149 = (r->x).n[3];
              uVar1162 = (r->x).n[2] * 2;
              (r->x).n[2] = uVar1162;
              uVar1149 = uVar1149 * 2;
              (r->x).n[3] = uVar1149;
              (r->x).n[4] = local_11d0 * 2;
              uVar1142 = uVar1142 + uVar1163;
              (r->x).n[0] = uVar1142;
              uVar1137 = uVar1137 + uVar1155;
              (r->x).n[1] = uVar1137;
              uVar1162 = uVar1162 + uVar1158;
              (r->x).n[2] = uVar1162;
              uVar1149 = uVar1149 + uVar1159;
              (r->x).n[3] = uVar1149;
              uVar1130 = 0x7fffffffffff8 - (local_11d0 * 2 + uVar1160);
              uVar1142 = 0x7ffff7ffffe178 - uVar1142;
              (r->x).n[0] = uVar1142;
              uVar1137 = 0x7ffffffffffff8 - uVar1137;
              (r->x).n[1] = uVar1137;
              uVar1162 = 0x7ffffffffffff8 - uVar1162;
              (r->x).n[2] = uVar1162;
              uVar1149 = 0x7ffffffffffff8 - uVar1149;
              (r->x).n[3] = uVar1149;
              (r->x).n[4] = uVar1130;
              uVar1142 = uVar1142 + local_1118;
              (r->x).n[0] = uVar1142;
              uVar1137 = uVar1137 + local_1110;
              (r->x).n[1] = uVar1137;
              uVar1162 = uVar1162 + local_1108;
              (r->x).n[2] = uVar1162;
              uVar1149 = uVar1149 + local_1100;
              (r->x).n[3] = uVar1149;
              uVar1130 = uVar1130 + local_10f8;
              (r->x).n[4] = uVar1130;
              uVar1142 = 0xbffff3ffffd234 - uVar1142;
              (r->y).n[0] = uVar1142;
              uVar1137 = 0xbffffffffffff4 - uVar1137;
              (r->y).n[1] = uVar1137;
              uVar1162 = 0xbffffffffffff4 - uVar1162;
              (r->y).n[2] = uVar1162;
              uVar1149 = 0xbffffffffffff4 - uVar1149;
              (r->y).n[3] = uVar1149;
              uVar1130 = 0xbfffffffffff4 - uVar1130;
              (r->y).n[4] = uVar1130;
              (r->y).n[0] = uVar1142 + local_11f0;
              (r->y).n[1] = uVar1137 + uStack_11e8;
              (r->y).n[2] = uVar1162 + local_11e0;
              (r->y).n[3] = uVar1149 + uStack_11d8;
              (r->y).n[4] = uVar1130 + local_11d0;
              uVar1153 = psVar1143->n[0];
              uVar1128 = (r->y).n[1];
              uVar1152 = (r->y).n[2];
              uVar1154 = (r->y).n[3];
              uVar1138 = (r->y).n[4];
              auVar444._8_8_ = 0;
              auVar444._0_8_ = local_1278.n[0];
              auVar910._8_8_ = 0;
              auVar910._0_8_ = uVar1154;
              auVar445._8_8_ = 0;
              auVar445._0_8_ = local_1278.n[1];
              auVar911._8_8_ = 0;
              auVar911._0_8_ = uVar1152;
              auVar446._8_8_ = 0;
              auVar446._0_8_ = local_1278.n[2];
              auVar912._8_8_ = 0;
              auVar912._0_8_ = uVar1128;
              auVar447._8_8_ = 0;
              auVar447._0_8_ = local_1278.n[3];
              auVar913._8_8_ = 0;
              auVar913._0_8_ = uVar1153;
              auVar448._8_8_ = 0;
              auVar448._0_8_ = local_1278.n[4];
              auVar914._8_8_ = 0;
              auVar914._0_8_ = uVar1138;
              uVar1139 = SUB168(auVar448 * auVar914,0);
              auVar449._8_8_ = 0;
              auVar449._0_8_ = uVar1139 & 0xfffffffffffff;
              auVar4 = auVar445 * auVar911 + auVar444 * auVar910 + auVar446 * auVar912 +
                       auVar447 * auVar913 + auVar449 * ZEXT816(0x1000003d10);
              uVar1140 = auVar4._0_8_;
              auVar1100._8_8_ = 0;
              auVar1100._0_8_ = uVar1140 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar450._8_8_ = 0;
              auVar450._0_8_ = local_1278.n[0];
              auVar915._8_8_ = 0;
              auVar915._0_8_ = uVar1138;
              auVar451._8_8_ = 0;
              auVar451._0_8_ = local_1278.n[1];
              auVar916._8_8_ = 0;
              auVar916._0_8_ = uVar1154;
              auVar452._8_8_ = 0;
              auVar452._0_8_ = local_1278.n[2];
              auVar917._8_8_ = 0;
              auVar917._0_8_ = uVar1152;
              auVar453._8_8_ = 0;
              auVar453._0_8_ = local_1278.n[3];
              auVar918._8_8_ = 0;
              auVar918._0_8_ = uVar1128;
              auVar454._8_8_ = 0;
              auVar454._0_8_ = local_1278.n[4];
              auVar919._8_8_ = 0;
              auVar919._0_8_ = uVar1153;
              auVar455._8_8_ = 0;
              auVar455._0_8_ = uVar1139 >> 0x34 | SUB168(auVar448 * auVar914,8) << 0xc;
              auVar4 = auVar450 * auVar915 + auVar1100 + auVar451 * auVar916 + auVar452 * auVar917 +
                       auVar453 * auVar918 + auVar454 * auVar919 + auVar455 * ZEXT816(0x1000003d10);
              uVar1139 = auVar4._0_8_;
              auVar1101._8_8_ = 0;
              auVar1101._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar456._8_8_ = 0;
              auVar456._0_8_ = local_1278.n[0];
              auVar920._8_8_ = 0;
              auVar920._0_8_ = uVar1153;
              auVar457._8_8_ = 0;
              auVar457._0_8_ = local_1278.n[1];
              auVar921._8_8_ = 0;
              auVar921._0_8_ = uVar1138;
              auVar458._8_8_ = 0;
              auVar458._0_8_ = local_1278.n[2];
              auVar922._8_8_ = 0;
              auVar922._0_8_ = uVar1154;
              auVar459._8_8_ = 0;
              auVar459._0_8_ = local_1278.n[3];
              auVar923._8_8_ = 0;
              auVar923._0_8_ = uVar1152;
              auVar460._8_8_ = 0;
              auVar460._0_8_ = local_1278.n[4];
              auVar924._8_8_ = 0;
              auVar924._0_8_ = uVar1128;
              auVar4 = auVar457 * auVar921 + auVar1101 + auVar458 * auVar922 + auVar459 * auVar923 +
                       auVar460 * auVar924;
              uVar1147 = auVar4._0_8_;
              auVar1103._8_8_ = 0;
              auVar1103._0_8_ = uVar1147 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar925._8_8_ = 0;
              auVar925._0_8_ =
                   (uVar1147 & 0xfffffffffffff) << 4 | (uVar1139 & 0xfffffffffffff) >> 0x30;
              auVar4 = auVar456 * auVar920 + ZEXT816(0x1000003d1) * auVar925;
              uVar1147 = auVar4._0_8_;
              psVar1143->n[0] = uVar1147 & 0xfffffffffffff;
              auVar1102._8_8_ = 0;
              auVar1102._0_8_ = uVar1147 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar461._8_8_ = 0;
              auVar461._0_8_ = local_1278.n[0];
              auVar926._8_8_ = 0;
              auVar926._0_8_ = uVar1128;
              auVar462._8_8_ = 0;
              auVar462._0_8_ = local_1278.n[1];
              auVar927._8_8_ = 0;
              auVar927._0_8_ = uVar1153;
              auVar463._8_8_ = 0;
              auVar463._0_8_ = local_1278.n[2];
              auVar928._8_8_ = 0;
              auVar928._0_8_ = uVar1138;
              auVar464._8_8_ = 0;
              auVar464._0_8_ = local_1278.n[3];
              auVar929._8_8_ = 0;
              auVar929._0_8_ = uVar1154;
              auVar465._8_8_ = 0;
              auVar465._0_8_ = local_1278.n[4];
              auVar930._8_8_ = 0;
              auVar930._0_8_ = uVar1152;
              auVar5 = auVar463 * auVar928 + auVar1103 + auVar464 * auVar929 + auVar465 * auVar930;
              uVar1147 = auVar5._0_8_;
              auVar466._8_8_ = 0;
              auVar466._0_8_ = uVar1147 & 0xfffffffffffff;
              auVar4 = auVar461 * auVar926 + auVar1102 + auVar462 * auVar927 +
                       auVar466 * ZEXT816(0x1000003d10);
              uVar1150 = auVar4._0_8_;
              auVar1105._8_8_ = 0;
              auVar1105._0_8_ = uVar1147 >> 0x34 | auVar5._8_8_ << 0xc;
              (r->y).n[1] = uVar1150 & 0xfffffffffffff;
              auVar1104._8_8_ = 0;
              auVar1104._0_8_ = uVar1150 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar467._8_8_ = 0;
              auVar467._0_8_ = local_1278.n[0];
              auVar931._8_8_ = 0;
              auVar931._0_8_ = uVar1152;
              auVar468._8_8_ = 0;
              auVar468._0_8_ = local_1278.n[1];
              auVar932._8_8_ = 0;
              auVar932._0_8_ = uVar1128;
              auVar469._8_8_ = 0;
              auVar469._0_8_ = local_1278.n[2];
              auVar933._8_8_ = 0;
              auVar933._0_8_ = uVar1153;
              auVar470._8_8_ = 0;
              auVar470._0_8_ = local_1278.n[3];
              auVar934._8_8_ = 0;
              auVar934._0_8_ = uVar1138;
              auVar471._8_8_ = 0;
              auVar471._0_8_ = local_1278.n[4];
              auVar935._8_8_ = 0;
              auVar935._0_8_ = uVar1154;
              auVar5 = auVar470 * auVar934 + auVar1105 + auVar471 * auVar935;
              uVar1153 = auVar5._0_8_;
              auVar472._8_8_ = 0;
              auVar472._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar467 * auVar931 + auVar1104 + auVar468 * auVar932 + auVar469 * auVar933 +
                       auVar472 * ZEXT816(0x1000003d10);
              uVar1128 = auVar4._0_8_;
              (r->y).n[2] = uVar1128 & 0xfffffffffffff;
              auVar1106._8_8_ = 0;
              auVar1106._0_8_ =
                   (uVar1128 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1140 & 0xfffffffffffff);
              auVar473._8_8_ = 0;
              auVar473._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1106 = auVar473 * ZEXT816(0x1000003d10) + auVar1106;
              uVar1153 = auVar1106._0_8_;
              (r->y).n[3] = uVar1153 & 0xfffffffffffff;
              (r->y).n[4] = (uVar1153 >> 0x34 | auVar1106._8_8_ << 0xc) +
                            (uVar1139 & 0xffffffffffff);
              auVar474._8_8_ = 0;
              auVar474._0_8_ = uVar1131;
              auVar936._8_8_ = 0;
              auVar936._0_8_ = uVar1159;
              auVar475._8_8_ = 0;
              auVar475._0_8_ = uVar1141;
              auVar937._8_8_ = 0;
              auVar937._0_8_ = uVar1158;
              auVar476._8_8_ = 0;
              auVar476._0_8_ = uVar1148;
              auVar938._8_8_ = 0;
              auVar938._0_8_ = uVar1155;
              auVar477._8_8_ = 0;
              auVar477._0_8_ = uVar1151;
              auVar939._8_8_ = 0;
              auVar939._0_8_ = uVar1163;
              auVar478._8_8_ = 0;
              auVar478._0_8_ = uVar1157;
              auVar940._8_8_ = 0;
              auVar940._0_8_ = uVar1160;
              uVar1153 = SUB168(auVar478 * auVar940,0);
              auVar479._8_8_ = 0;
              auVar479._0_8_ = uVar1153 & 0xfffffffffffff;
              auVar4 = auVar475 * auVar937 + auVar474 * auVar936 + auVar476 * auVar938 +
                       auVar477 * auVar939 + auVar479 * ZEXT816(0x1000003d10);
              uVar1128 = auVar4._0_8_;
              auVar1107._8_8_ = 0;
              auVar1107._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar480._8_8_ = 0;
              auVar480._0_8_ = uVar1131;
              auVar941._8_8_ = 0;
              auVar941._0_8_ = uVar1160;
              auVar481._8_8_ = 0;
              auVar481._0_8_ = uVar1141;
              auVar942._8_8_ = 0;
              auVar942._0_8_ = uVar1159;
              auVar482._8_8_ = 0;
              auVar482._0_8_ = uVar1148;
              auVar943._8_8_ = 0;
              auVar943._0_8_ = uVar1158;
              auVar483._8_8_ = 0;
              auVar483._0_8_ = uVar1151;
              auVar944._8_8_ = 0;
              auVar944._0_8_ = uVar1155;
              auVar484._8_8_ = 0;
              auVar484._0_8_ = uVar1157;
              auVar945._8_8_ = 0;
              auVar945._0_8_ = uVar1163;
              auVar485._8_8_ = 0;
              auVar485._0_8_ = uVar1153 >> 0x34 | SUB168(auVar478 * auVar940,8) << 0xc;
              auVar4 = auVar480 * auVar941 + auVar1107 + auVar481 * auVar942 + auVar482 * auVar943 +
                       auVar483 * auVar944 + auVar484 * auVar945 + auVar485 * ZEXT816(0x1000003d10);
              uVar1153 = auVar4._0_8_;
              auVar1108._8_8_ = 0;
              auVar1108._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
              local_1250 = (uVar1153 & 0xfffffffffffff) >> 0x30;
              auVar486._8_8_ = 0;
              auVar486._0_8_ = uVar1131;
              auVar946._8_8_ = 0;
              auVar946._0_8_ = uVar1163;
              auVar487._8_8_ = 0;
              auVar487._0_8_ = uVar1141;
              auVar947._8_8_ = 0;
              auVar947._0_8_ = uVar1160;
              auVar488._8_8_ = 0;
              auVar488._0_8_ = uVar1148;
              auVar948._8_8_ = 0;
              auVar948._0_8_ = uVar1159;
              auVar489._8_8_ = 0;
              auVar489._0_8_ = uVar1151;
              auVar949._8_8_ = 0;
              auVar949._0_8_ = uVar1158;
              auVar490._8_8_ = 0;
              auVar490._0_8_ = uVar1157;
              auVar950._8_8_ = 0;
              auVar950._0_8_ = uVar1155;
              auVar4 = auVar487 * auVar947 + auVar1108 + auVar488 * auVar948 + auVar489 * auVar949 +
                       auVar490 * auVar950;
              uVar1152 = auVar4._0_8_;
              auVar1110._8_8_ = 0;
              auVar1110._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar951._8_8_ = 0;
              auVar951._0_8_ = (uVar1152 & 0xfffffffffffff) << 4 | local_1250;
              auVar4 = auVar486 * auVar946 + ZEXT816(0x1000003d1) * auVar951;
              uVar1154 = auVar4._0_8_;
              auVar1109._8_8_ = 0;
              auVar1109._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar491._8_8_ = 0;
              auVar491._0_8_ = uVar1131;
              auVar952._8_8_ = 0;
              auVar952._0_8_ = uVar1155;
              auVar492._8_8_ = 0;
              auVar492._0_8_ = uVar1141;
              auVar953._8_8_ = 0;
              auVar953._0_8_ = uVar1163;
              auVar493._8_8_ = 0;
              auVar493._0_8_ = uVar1148;
              auVar954._8_8_ = 0;
              auVar954._0_8_ = uVar1160;
              auVar494._8_8_ = 0;
              auVar494._0_8_ = uVar1151;
              auVar955._8_8_ = 0;
              auVar955._0_8_ = uVar1159;
              auVar495._8_8_ = 0;
              auVar495._0_8_ = uVar1157;
              auVar956._8_8_ = 0;
              auVar956._0_8_ = uVar1158;
              auVar5 = auVar493 * auVar954 + auVar1110 + auVar494 * auVar955 + auVar495 * auVar956;
              uVar1152 = auVar5._0_8_;
              auVar496._8_8_ = 0;
              auVar496._0_8_ = uVar1152 & 0xfffffffffffff;
              auVar4 = auVar491 * auVar952 + auVar1109 + auVar492 * auVar953 +
                       auVar496 * ZEXT816(0x1000003d10);
              uVar1138 = auVar4._0_8_;
              auVar1112._8_8_ = 0;
              auVar1112._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1111._8_8_ = 0;
              auVar1111._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
              auVar497._8_8_ = 0;
              auVar497._0_8_ = uVar1131;
              auVar957._8_8_ = 0;
              auVar957._0_8_ = uVar1158;
              auVar498._8_8_ = 0;
              auVar498._0_8_ = uVar1141;
              auVar958._8_8_ = 0;
              auVar958._0_8_ = uVar1155;
              auVar499._8_8_ = 0;
              auVar499._0_8_ = uVar1148;
              auVar959._8_8_ = 0;
              auVar959._0_8_ = uVar1163;
              auVar500._8_8_ = 0;
              auVar500._0_8_ = uVar1151;
              auVar960._8_8_ = 0;
              auVar960._0_8_ = uVar1160;
              auVar501._8_8_ = 0;
              auVar501._0_8_ = uVar1157;
              auVar961._8_8_ = 0;
              auVar961._0_8_ = uVar1159;
              auVar5 = auVar500 * auVar960 + auVar1112 + auVar501 * auVar961;
              uVar1131 = auVar5._0_8_;
              auVar502._8_8_ = 0;
              auVar502._0_8_ = uVar1131 & 0xfffffffffffff;
              auVar4 = auVar497 * auVar957 + auVar1111 + auVar498 * auVar958 + auVar499 * auVar959 +
                       auVar502 * ZEXT816(0x1000003d10);
              uVar1152 = auVar4._0_8_;
              auVar1113._8_8_ = 0;
              auVar1113._0_8_ =
                   (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1128 & 0xfffffffffffff);
              auVar503._8_8_ = 0;
              auVar503._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
              auVar1113 = auVar503 * ZEXT816(0x1000003d10) + auVar1113;
              uVar1128 = auVar1113._0_8_;
              (r->y).n[0] = (r->y).n[0] + (0x3ffffbfffff0bc - (uVar1154 & 0xfffffffffffff));
              puVar2 = (r->y).n + 1;
              *puVar2 = *puVar2 + (0x3ffffffffffffc - (uVar1138 & 0xfffffffffffff));
              puVar2 = (r->y).n + 2;
              *puVar2 = *puVar2 + (0x3ffffffffffffc - (uVar1152 & 0xfffffffffffff));
              puVar2 = (r->y).n + 3;
              *puVar2 = *puVar2 + (0x3ffffffffffffc - (uVar1128 & 0xfffffffffffff));
              puVar2 = (r->y).n + 4;
              *puVar2 = *puVar2 + (0x3fffffffffffc -
                                  ((uVar1128 >> 0x34 | auVar1113._8_8_ << 0xc) +
                                  (uVar1153 & 0xffffffffffff)));
            }
            else {
              iVar1127 = secp256k1_fe_normalizes_to_zero_var(&local_1278);
              if (iVar1127 == 0) {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                (r->x).n[4] = 0;
                (r->y).n[0] = 0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              else {
                secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
              }
            }
          }
          else {
            r->infinity = 0;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = local_1178 * 2;
            auVar586._8_8_ = 0;
            auVar586._0_8_ = uStack_1160;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = uStack_1170 * 2;
            auVar587._8_8_ = 0;
            auVar587._0_8_ = local_1168;
            auVar66._8_8_ = 0;
            auVar66._0_8_ = local_1158;
            auVar588._8_8_ = 0;
            auVar588._0_8_ = local_1158;
            uVar1128 = SUB168(auVar66 * auVar588,0);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar1128 & 0xfffffffffffff;
            auVar4 = auVar65 * auVar587 + auVar64 * auVar586 + auVar67 * ZEXT816(0x1000003d10);
            uVar1131 = auVar4._0_8_;
            auVar1002._8_8_ = 0;
            auVar1002._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            uVar1153 = local_1158 * 2;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = local_1178;
            auVar589._8_8_ = 0;
            auVar589._0_8_ = uVar1153;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = uStack_1170 * 2;
            auVar590._8_8_ = 0;
            auVar590._0_8_ = uStack_1160;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = local_1168;
            auVar591._8_8_ = 0;
            auVar591._0_8_ = local_1168;
            auVar71._8_8_ = 0;
            auVar71._0_8_ = uVar1128 >> 0x34 | SUB168(auVar66 * auVar588,8) << 0xc;
            auVar4 = auVar68 * auVar589 + auVar1002 + auVar69 * auVar590 + auVar70 * auVar591 +
                     auVar71 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            auVar1003._8_8_ = 0;
            auVar1003._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = local_1178;
            auVar592._8_8_ = 0;
            auVar592._0_8_ = local_1178;
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uStack_1170;
            auVar593._8_8_ = 0;
            auVar593._0_8_ = uVar1153;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = local_1168 * 2;
            auVar594._8_8_ = 0;
            auVar594._0_8_ = uStack_1160;
            auVar4 = auVar73 * auVar593 + auVar1003 + auVar74 * auVar594;
            uVar1152 = auVar4._0_8_;
            auVar1005._8_8_ = 0;
            auVar1005._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar595._8_8_ = 0;
            auVar595._0_8_ =
                 (uVar1152 & 0xfffffffffffff) << 4 | (uVar1128 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar72 * auVar592 + ZEXT816(0x1000003d1) * auVar595;
            uVar1152 = auVar4._0_8_;
            local_10c8.x.n[0] = uVar1152 & 0xfffffffffffff;
            auVar1004._8_8_ = 0;
            auVar1004._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = local_1178 * 2;
            auVar596._8_8_ = 0;
            auVar596._0_8_ = uStack_1170;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = local_1168;
            auVar597._8_8_ = 0;
            auVar597._0_8_ = uVar1153;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = uStack_1160;
            auVar598._8_8_ = 0;
            auVar598._0_8_ = uStack_1160;
            auVar5 = auVar76 * auVar597 + auVar1005 + auVar77 * auVar598;
            uVar1152 = auVar5._0_8_;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = uVar1152 & 0xfffffffffffff;
            auVar4 = auVar75 * auVar596 + auVar1004 + auVar78 * ZEXT816(0x1000003d10);
            uVar1154 = auVar4._0_8_;
            auVar1007._8_8_ = 0;
            auVar1007._0_8_ = uVar1152 >> 0x34 | auVar5._8_8_ << 0xc;
            local_10c8.x.n[1] = uVar1154 & 0xfffffffffffff;
            auVar1006._8_8_ = 0;
            auVar1006._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = local_1178 * 2;
            auVar599._8_8_ = 0;
            auVar599._0_8_ = local_1168;
            auVar80._8_8_ = 0;
            auVar80._0_8_ = uStack_1170;
            auVar600._8_8_ = 0;
            auVar600._0_8_ = uStack_1170;
            auVar81._8_8_ = 0;
            auVar81._0_8_ = uStack_1160;
            auVar601._8_8_ = 0;
            auVar601._0_8_ = uVar1153;
            auVar1007 = auVar81 * auVar601 + auVar1007;
            uVar1153 = auVar1007._0_8_;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar79 * auVar599 + auVar1006 + auVar80 * auVar600 +
                     auVar82 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            local_10c8.x.n[2] = uVar1152 & 0xfffffffffffff;
            auVar1008._8_8_ = 0;
            auVar1008._0_8_ =
                 (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1131 & 0xfffffffffffff);
            auVar83._8_8_ = 0;
            auVar83._0_8_ = uVar1153 >> 0x34 | auVar1007._8_8_ << 0xc;
            auVar1008 = auVar83 * ZEXT816(0x1000003d10) + auVar1008;
            uVar1153 = auVar1008._0_8_;
            local_10c8.x.n[3] = uVar1153 & 0xfffffffffffff;
            local_10c8.x.n[4] =
                 (uVar1153 >> 0x34 | auVar1008._8_8_ << 0xc) + (uVar1128 & 0xffffffffffff);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = local_1178;
            auVar602._8_8_ = 0;
            auVar602._0_8_ = local_10c8.x.n[3];
            auVar85._8_8_ = 0;
            auVar85._0_8_ = uStack_1170;
            auVar603._8_8_ = 0;
            auVar603._0_8_ = local_10c8.x.n[2];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = local_1168;
            auVar604._8_8_ = 0;
            auVar604._0_8_ = local_10c8.x.n[1];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uStack_1160;
            auVar605._8_8_ = 0;
            auVar605._0_8_ = local_10c8.x.n[0];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = local_1158;
            auVar606._8_8_ = 0;
            auVar606._0_8_ = local_10c8.x.n[4];
            uVar1153 = SUB168(auVar88 * auVar606,0);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar85 * auVar603 + auVar84 * auVar602 + auVar86 * auVar604 +
                     auVar87 * auVar605 + auVar89 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            auVar1009._8_8_ = 0;
            auVar1009._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = local_1178;
            auVar607._8_8_ = 0;
            auVar607._0_8_ = local_10c8.x.n[4];
            auVar91._8_8_ = 0;
            auVar91._0_8_ = uStack_1170;
            auVar608._8_8_ = 0;
            auVar608._0_8_ = local_10c8.x.n[3];
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_1168;
            auVar609._8_8_ = 0;
            auVar609._0_8_ = local_10c8.x.n[2];
            auVar93._8_8_ = 0;
            auVar93._0_8_ = uStack_1160;
            auVar610._8_8_ = 0;
            auVar610._0_8_ = local_10c8.x.n[1];
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_1158;
            auVar611._8_8_ = 0;
            auVar611._0_8_ = local_10c8.x.n[0];
            auVar95._8_8_ = 0;
            auVar95._0_8_ = uVar1153 >> 0x34 | SUB168(auVar88 * auVar606,8) << 0xc;
            auVar4 = auVar90 * auVar607 + auVar1009 + auVar91 * auVar608 + auVar92 * auVar609 +
                     auVar93 * auVar610 + auVar94 * auVar611 + auVar95 * ZEXT816(0x1000003d10);
            uVar1153 = auVar4._0_8_;
            auVar1010._8_8_ = 0;
            auVar1010._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = local_1178;
            auVar612._8_8_ = 0;
            auVar612._0_8_ = local_10c8.x.n[0];
            auVar97._8_8_ = 0;
            auVar97._0_8_ = uStack_1170;
            auVar613._8_8_ = 0;
            auVar613._0_8_ = local_10c8.x.n[4];
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_1168;
            auVar614._8_8_ = 0;
            auVar614._0_8_ = local_10c8.x.n[3];
            auVar99._8_8_ = 0;
            auVar99._0_8_ = uStack_1160;
            auVar615._8_8_ = 0;
            auVar615._0_8_ = local_10c8.x.n[2];
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_1158;
            auVar616._8_8_ = 0;
            auVar616._0_8_ = local_10c8.x.n[1];
            auVar4 = auVar97 * auVar613 + auVar1010 + auVar98 * auVar614 + auVar99 * auVar615 +
                     auVar100 * auVar616;
            uVar1131 = auVar4._0_8_;
            auVar1012._8_8_ = 0;
            auVar1012._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar617._8_8_ = 0;
            auVar617._0_8_ =
                 (uVar1131 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar96 * auVar612 + ZEXT816(0x1000003d1) * auVar617;
            uVar1131 = auVar4._0_8_;
            local_1140 = uVar1131 & 0xfffffffffffff;
            auVar1011._8_8_ = 0;
            auVar1011._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_1178;
            auVar618._8_8_ = 0;
            auVar618._0_8_ = local_10c8.x.n[1];
            auVar102._8_8_ = 0;
            auVar102._0_8_ = uStack_1170;
            auVar619._8_8_ = 0;
            auVar619._0_8_ = local_10c8.x.n[0];
            auVar103._8_8_ = 0;
            auVar103._0_8_ = local_1168;
            auVar620._8_8_ = 0;
            auVar620._0_8_ = local_10c8.x.n[4];
            auVar104._8_8_ = 0;
            auVar104._0_8_ = uStack_1160;
            auVar621._8_8_ = 0;
            auVar621._0_8_ = local_10c8.x.n[3];
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_1158;
            auVar622._8_8_ = 0;
            auVar622._0_8_ = local_10c8.x.n[2];
            auVar5 = auVar103 * auVar620 + auVar1012 + auVar104 * auVar621 + auVar105 * auVar622;
            uVar1131 = auVar5._0_8_;
            auVar106._8_8_ = 0;
            auVar106._0_8_ = uVar1131 & 0xfffffffffffff;
            auVar4 = auVar101 * auVar618 + auVar1011 + auVar102 * auVar619 +
                     auVar106 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            auVar1014._8_8_ = 0;
            auVar1014._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
            local_1138 = uVar1152 & 0xfffffffffffff;
            auVar1013._8_8_ = 0;
            auVar1013._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = local_1178;
            auVar623._8_8_ = 0;
            auVar623._0_8_ = local_10c8.x.n[2];
            auVar108._8_8_ = 0;
            auVar108._0_8_ = uStack_1170;
            auVar624._8_8_ = 0;
            auVar624._0_8_ = local_10c8.x.n[1];
            auVar109._8_8_ = 0;
            auVar109._0_8_ = local_1168;
            auVar625._8_8_ = 0;
            auVar625._0_8_ = local_10c8.x.n[0];
            auVar110._8_8_ = 0;
            auVar110._0_8_ = uStack_1160;
            auVar626._8_8_ = 0;
            auVar626._0_8_ = local_10c8.x.n[4];
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_1158;
            auVar627._8_8_ = 0;
            auVar627._0_8_ = local_10c8.x.n[3];
            auVar5 = auVar110 * auVar626 + auVar1014 + auVar111 * auVar627;
            uVar1131 = auVar5._0_8_;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = uVar1131 & 0xfffffffffffff;
            auVar4 = auVar107 * auVar623 + auVar1013 + auVar108 * auVar624 + auVar109 * auVar625 +
                     auVar112 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            local_1130 = uVar1152 & 0xfffffffffffff;
            auVar1015._8_8_ = 0;
            auVar1015._0_8_ =
                 (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1128 & 0xfffffffffffff);
            auVar113._8_8_ = 0;
            auVar113._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1015 = auVar113 * ZEXT816(0x1000003d10) + auVar1015;
            uVar1128 = auVar1015._0_8_;
            local_1128 = uVar1128 & 0xfffffffffffff;
            local_1120 = (uVar1128 >> 0x34 | auVar1015._8_8_ << 0xc) + (uVar1153 & 0xffffffffffff);
            auVar114._8_8_ = 0;
            auVar114._0_8_ = local_10c8.x.n[0];
            auVar628._8_8_ = 0;
            auVar628._0_8_ = local_1248.x.n[3];
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_10c8.x.n[1];
            auVar629._8_8_ = 0;
            auVar629._0_8_ = local_1248.x.n[2];
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_10c8.x.n[2];
            auVar630._8_8_ = 0;
            auVar630._0_8_ = local_1248.x.n[1];
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_10c8.x.n[3];
            auVar631._8_8_ = 0;
            auVar631._0_8_ = local_1248.x.n[0];
            auVar118._8_8_ = 0;
            auVar118._0_8_ = local_10c8.x.n[4];
            auVar632._8_8_ = 0;
            auVar632._0_8_ = local_1248.x.n[4];
            uVar1153 = SUB168(auVar118 * auVar632,0);
            auVar119._8_8_ = 0;
            auVar119._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar115 * auVar629 + auVar114 * auVar628 + auVar116 * auVar630 +
                     auVar117 * auVar631 + auVar119 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            auVar1016._8_8_ = 0;
            auVar1016._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar120._8_8_ = 0;
            auVar120._0_8_ = local_10c8.x.n[0];
            auVar633._8_8_ = 0;
            auVar633._0_8_ = local_1248.x.n[4];
            auVar121._8_8_ = 0;
            auVar121._0_8_ = local_10c8.x.n[1];
            auVar634._8_8_ = 0;
            auVar634._0_8_ = local_1248.x.n[3];
            auVar122._8_8_ = 0;
            auVar122._0_8_ = local_10c8.x.n[2];
            auVar635._8_8_ = 0;
            auVar635._0_8_ = local_1248.x.n[2];
            auVar123._8_8_ = 0;
            auVar123._0_8_ = local_10c8.x.n[3];
            auVar636._8_8_ = 0;
            auVar636._0_8_ = local_1248.x.n[1];
            auVar124._8_8_ = 0;
            auVar124._0_8_ = local_10c8.x.n[4];
            auVar637._8_8_ = 0;
            auVar637._0_8_ = local_1248.x.n[0];
            auVar125._8_8_ = 0;
            auVar125._0_8_ = uVar1153 >> 0x34 | SUB168(auVar118 * auVar632,8) << 0xc;
            auVar4 = auVar120 * auVar633 + auVar1016 + auVar121 * auVar634 + auVar122 * auVar635 +
                     auVar123 * auVar636 + auVar124 * auVar637 + auVar125 * ZEXT816(0x1000003d10);
            uVar1153 = auVar4._0_8_;
            auVar1017._8_8_ = 0;
            auVar1017._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar126._8_8_ = 0;
            auVar126._0_8_ = local_10c8.x.n[0];
            auVar638._8_8_ = 0;
            auVar638._0_8_ = local_1248.x.n[0];
            auVar127._8_8_ = 0;
            auVar127._0_8_ = local_10c8.x.n[1];
            auVar639._8_8_ = 0;
            auVar639._0_8_ = local_1248.x.n[4];
            auVar128._8_8_ = 0;
            auVar128._0_8_ = local_10c8.x.n[2];
            auVar640._8_8_ = 0;
            auVar640._0_8_ = local_1248.x.n[3];
            auVar129._8_8_ = 0;
            auVar129._0_8_ = local_10c8.x.n[3];
            auVar641._8_8_ = 0;
            auVar641._0_8_ = local_1248.x.n[2];
            auVar130._8_8_ = 0;
            auVar130._0_8_ = local_10c8.x.n[4];
            auVar642._8_8_ = 0;
            auVar642._0_8_ = local_1248.x.n[1];
            auVar4 = auVar127 * auVar639 + auVar1017 + auVar128 * auVar640 + auVar129 * auVar641 +
                     auVar130 * auVar642;
            uVar1131 = auVar4._0_8_;
            auVar1019._8_8_ = 0;
            auVar1019._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar643._8_8_ = 0;
            auVar643._0_8_ =
                 (uVar1131 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar126 * auVar638 + ZEXT816(0x1000003d1) * auVar643;
            uVar1131 = auVar4._0_8_;
            (r->x).n[0] = uVar1131 & 0xfffffffffffff;
            auVar1018._8_8_ = 0;
            auVar1018._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar131._8_8_ = 0;
            auVar131._0_8_ = local_10c8.x.n[0];
            auVar644._8_8_ = 0;
            auVar644._0_8_ = local_1248.x.n[1];
            auVar132._8_8_ = 0;
            auVar132._0_8_ = local_10c8.x.n[1];
            auVar645._8_8_ = 0;
            auVar645._0_8_ = local_1248.x.n[0];
            auVar133._8_8_ = 0;
            auVar133._0_8_ = local_10c8.x.n[2];
            auVar646._8_8_ = 0;
            auVar646._0_8_ = local_1248.x.n[4];
            auVar134._8_8_ = 0;
            auVar134._0_8_ = local_10c8.x.n[3];
            auVar647._8_8_ = 0;
            auVar647._0_8_ = local_1248.x.n[3];
            auVar135._8_8_ = 0;
            auVar135._0_8_ = local_10c8.x.n[4];
            auVar648._8_8_ = 0;
            auVar648._0_8_ = local_1248.x.n[2];
            auVar5 = auVar133 * auVar646 + auVar1019 + auVar134 * auVar647 + auVar135 * auVar648;
            uVar1131 = auVar5._0_8_;
            auVar136._8_8_ = 0;
            auVar136._0_8_ = uVar1131 & 0xfffffffffffff;
            auVar4 = auVar131 * auVar644 + auVar1018 + auVar132 * auVar645 +
                     auVar136 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            auVar1021._8_8_ = 0;
            auVar1021._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
            (r->x).n[1] = uVar1152 & 0xfffffffffffff;
            auVar1020._8_8_ = 0;
            auVar1020._0_8_ = uVar1152 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar137._8_8_ = 0;
            auVar137._0_8_ = local_10c8.x.n[0];
            auVar649._8_8_ = 0;
            auVar649._0_8_ = local_1248.x.n[2];
            auVar138._8_8_ = 0;
            auVar138._0_8_ = local_10c8.x.n[1];
            auVar650._8_8_ = 0;
            auVar650._0_8_ = local_1248.x.n[1];
            auVar139._8_8_ = 0;
            auVar139._0_8_ = local_10c8.x.n[2];
            auVar651._8_8_ = 0;
            auVar651._0_8_ = local_1248.x.n[0];
            auVar140._8_8_ = 0;
            auVar140._0_8_ = local_10c8.x.n[3];
            auVar652._8_8_ = 0;
            auVar652._0_8_ = local_1248.x.n[4];
            auVar141._8_8_ = 0;
            auVar141._0_8_ = local_10c8.x.n[4];
            auVar653._8_8_ = 0;
            auVar653._0_8_ = local_1248.x.n[3];
            auVar5 = auVar140 * auVar652 + auVar1021 + auVar141 * auVar653;
            uVar1131 = auVar5._0_8_;
            auVar142._8_8_ = 0;
            auVar142._0_8_ = uVar1131 & 0xfffffffffffff;
            auVar4 = auVar137 * auVar649 + auVar1020 + auVar138 * auVar650 + auVar139 * auVar651 +
                     auVar142 * ZEXT816(0x1000003d10);
            uVar1152 = auVar4._0_8_;
            (r->x).n[2] = uVar1152 & 0xfffffffffffff;
            auVar1022._8_8_ = 0;
            auVar1022._0_8_ =
                 (uVar1152 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1128 & 0xfffffffffffff);
            auVar143._8_8_ = 0;
            auVar143._0_8_ = uVar1131 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1022 = auVar143 * ZEXT816(0x1000003d10) + auVar1022;
            uVar1128 = auVar1022._0_8_;
            (r->x).n[3] = uVar1128 & 0xfffffffffffff;
            (r->x).n[4] = (uVar1128 >> 0x34 | auVar1022._8_8_ << 0xc) + (uVar1153 & 0xffffffffffff);
            auVar144._8_8_ = 0;
            auVar144._0_8_ = local_1140;
            auVar654._8_8_ = 0;
            auVar654._0_8_ = local_1248.y.n[3];
            auVar145._8_8_ = 0;
            auVar145._0_8_ = local_1138;
            auVar655._8_8_ = 0;
            auVar655._0_8_ = local_1248.y.n[2];
            auVar146._8_8_ = 0;
            auVar146._0_8_ = local_1130;
            auVar656._8_8_ = 0;
            auVar656._0_8_ = local_1248.y.n[1];
            auVar147._8_8_ = 0;
            auVar147._0_8_ = local_1128;
            auVar657._8_8_ = 0;
            auVar657._0_8_ = local_1248.y.n[0];
            auVar148._8_8_ = 0;
            auVar148._0_8_ = local_1120;
            auVar658._8_8_ = 0;
            auVar658._0_8_ = local_1248.y.n[4];
            uVar1153 = SUB168(auVar148 * auVar658,0);
            auVar149._8_8_ = 0;
            auVar149._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar145 * auVar655 + auVar144 * auVar654 + auVar146 * auVar656 +
                     auVar147 * auVar657 + auVar149 * ZEXT816(0x1000003d10);
            uVar1128 = auVar4._0_8_;
            auVar1023._8_8_ = 0;
            auVar1023._0_8_ = uVar1128 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar150._8_8_ = 0;
            auVar150._0_8_ = local_1140;
            auVar659._8_8_ = 0;
            auVar659._0_8_ = local_1248.y.n[4];
            auVar151._8_8_ = 0;
            auVar151._0_8_ = local_1138;
            auVar660._8_8_ = 0;
            auVar660._0_8_ = local_1248.y.n[3];
            auVar152._8_8_ = 0;
            auVar152._0_8_ = local_1130;
            auVar661._8_8_ = 0;
            auVar661._0_8_ = local_1248.y.n[2];
            auVar153._8_8_ = 0;
            auVar153._0_8_ = local_1128;
            auVar662._8_8_ = 0;
            auVar662._0_8_ = local_1248.y.n[1];
            auVar154._8_8_ = 0;
            auVar154._0_8_ = local_1120;
            auVar663._8_8_ = 0;
            auVar663._0_8_ = local_1248.y.n[0];
            auVar155._8_8_ = 0;
            auVar155._0_8_ = uVar1153 >> 0x34 | SUB168(auVar148 * auVar658,8) << 0xc;
            auVar4 = auVar150 * auVar659 + auVar1023 + auVar151 * auVar660 + auVar152 * auVar661 +
                     auVar153 * auVar662 + auVar154 * auVar663 + auVar155 * ZEXT816(0x1000003d10);
            uVar1153 = auVar4._0_8_;
            auVar1024._8_8_ = 0;
            auVar1024._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            local_11c8 = uVar1153 & 0xffffffffffff;
            auVar156._8_8_ = 0;
            auVar156._0_8_ = local_1140;
            auVar664._8_8_ = 0;
            auVar664._0_8_ = local_1248.y.n[0];
            auVar157._8_8_ = 0;
            auVar157._0_8_ = local_1138;
            auVar665._8_8_ = 0;
            auVar665._0_8_ = local_1248.y.n[4];
            auVar158._8_8_ = 0;
            auVar158._0_8_ = local_1130;
            auVar666._8_8_ = 0;
            auVar666._0_8_ = local_1248.y.n[3];
            auVar159._8_8_ = 0;
            auVar159._0_8_ = local_1128;
            auVar667._8_8_ = 0;
            auVar667._0_8_ = local_1248.y.n[2];
            auVar160._8_8_ = 0;
            auVar160._0_8_ = local_1120;
            auVar668._8_8_ = 0;
            auVar668._0_8_ = local_1248.y.n[1];
            auVar4 = auVar157 * auVar665 + auVar1024 + auVar158 * auVar666 + auVar159 * auVar667 +
                     auVar160 * auVar668;
            uVar1131 = auVar4._0_8_;
            auVar1026._8_8_ = 0;
            auVar1026._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar669._8_8_ = 0;
            auVar669._0_8_ =
                 (uVar1131 & 0xfffffffffffff) << 4 | (uVar1153 & 0xfffffffffffff) >> 0x30;
            auVar4 = auVar156 * auVar664 + ZEXT816(0x1000003d1) * auVar669;
            uVar1153 = auVar4._0_8_;
            psVar1143->n[0] = uVar1153 & 0xfffffffffffff;
            auVar1025._8_8_ = 0;
            auVar1025._0_8_ = uVar1153 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar161._8_8_ = 0;
            auVar161._0_8_ = local_1140;
            auVar670._8_8_ = 0;
            auVar670._0_8_ = local_1248.y.n[1];
            auVar162._8_8_ = 0;
            auVar162._0_8_ = local_1138;
            auVar671._8_8_ = 0;
            auVar671._0_8_ = local_1248.y.n[0];
            auVar163._8_8_ = 0;
            auVar163._0_8_ = local_1130;
            auVar672._8_8_ = 0;
            auVar672._0_8_ = local_1248.y.n[4];
            auVar164._8_8_ = 0;
            auVar164._0_8_ = local_1128;
            auVar673._8_8_ = 0;
            auVar673._0_8_ = local_1248.y.n[3];
            auVar165._8_8_ = 0;
            auVar165._0_8_ = local_1120;
            auVar674._8_8_ = 0;
            auVar674._0_8_ = local_1248.y.n[2];
            auVar5 = auVar163 * auVar672 + auVar1026 + auVar164 * auVar673 + auVar165 * auVar674;
            uVar1153 = auVar5._0_8_;
            auVar166._8_8_ = 0;
            auVar166._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar161 * auVar670 + auVar1025 + auVar162 * auVar671 +
                     auVar166 * ZEXT816(0x1000003d10);
            uVar1131 = auVar4._0_8_;
            auVar1028._8_8_ = 0;
            auVar1028._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
            (r->y).n[1] = uVar1131 & 0xfffffffffffff;
            auVar1027._8_8_ = 0;
            auVar1027._0_8_ = uVar1131 >> 0x34 | auVar4._8_8_ << 0xc;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = local_1140;
            auVar675._8_8_ = 0;
            auVar675._0_8_ = local_1248.y.n[2];
            auVar168._8_8_ = 0;
            auVar168._0_8_ = local_1138;
            auVar676._8_8_ = 0;
            auVar676._0_8_ = local_1248.y.n[1];
            auVar169._8_8_ = 0;
            auVar169._0_8_ = local_1130;
            auVar677._8_8_ = 0;
            auVar677._0_8_ = local_1248.y.n[0];
            auVar170._8_8_ = 0;
            auVar170._0_8_ = local_1128;
            auVar678._8_8_ = 0;
            auVar678._0_8_ = local_1248.y.n[4];
            auVar171._8_8_ = 0;
            auVar171._0_8_ = local_1120;
            auVar679._8_8_ = 0;
            auVar679._0_8_ = local_1248.y.n[3];
            auVar5 = auVar170 * auVar678 + auVar1028 + auVar171 * auVar679;
            uVar1153 = auVar5._0_8_;
            auVar172._8_8_ = 0;
            auVar172._0_8_ = uVar1153 & 0xfffffffffffff;
            auVar4 = auVar167 * auVar675 + auVar1027 + auVar168 * auVar676 + auVar169 * auVar677 +
                     auVar172 * ZEXT816(0x1000003d10);
            uVar1131 = auVar4._0_8_;
            (r->y).n[2] = uVar1131 & 0xfffffffffffff;
            auVar1029._8_8_ = 0;
            auVar1029._0_8_ =
                 (uVar1131 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1128 & 0xfffffffffffff);
            auVar173._8_8_ = 0;
            auVar173._0_8_ = uVar1153 >> 0x34 | auVar5._8_8_ << 0xc;
            auVar1029 = auVar173 * ZEXT816(0x1000003d10) + auVar1029;
            uVar1153 = auVar1029._0_8_;
            (r->y).n[3] = uVar1153 & 0xfffffffffffff;
            (r->y).n[4] = (uVar1153 >> 0x34 | auVar1029._8_8_ << 0xc) + local_11c8;
            (r->z).n[0] = 1;
            (r->z).n[3] = 0;
            (r->z).n[4] = 0;
            (r->z).n[1] = 0;
            (r->z).n[2] = 0;
          }
        }
      }
      bVar3 = 1 < (long)uVar1132;
      uVar1132 = uVar1132 - 1;
    } while (bVar3);
  }
  if (r->infinity == 0) {
    uVar1132 = (r->z).n[0];
    uVar1153 = (r->z).n[1];
    uVar1128 = (r->z).n[2];
    uVar1131 = (r->z).n[3];
    uVar1152 = (r->z).n[4];
    auVar504._8_8_ = 0;
    auVar504._0_8_ = local_1178;
    auVar962._8_8_ = 0;
    auVar962._0_8_ = uVar1131;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uStack_1170;
    auVar963._8_8_ = 0;
    auVar963._0_8_ = uVar1128;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = local_1168;
    auVar964._8_8_ = 0;
    auVar964._0_8_ = uVar1153;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uStack_1160;
    auVar965._8_8_ = 0;
    auVar965._0_8_ = uVar1132;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = local_1158;
    auVar966._8_8_ = 0;
    auVar966._0_8_ = uVar1152;
    uVar1154 = SUB168(auVar508 * auVar966,0);
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar1154 & 0xfffffffffffff;
    auVar4 = auVar505 * auVar963 + auVar504 * auVar962 + auVar506 * auVar964 + auVar507 * auVar965 +
             auVar509 * ZEXT816(0x1000003d10);
    uVar1138 = auVar4._0_8_;
    auVar1114._8_8_ = 0;
    auVar1114._0_8_ = uVar1138 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = local_1178;
    auVar967._8_8_ = 0;
    auVar967._0_8_ = uVar1152;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uStack_1170;
    auVar968._8_8_ = 0;
    auVar968._0_8_ = uVar1131;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = local_1168;
    auVar969._8_8_ = 0;
    auVar969._0_8_ = uVar1128;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = uStack_1160;
    auVar970._8_8_ = 0;
    auVar970._0_8_ = uVar1153;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = local_1158;
    auVar971._8_8_ = 0;
    auVar971._0_8_ = uVar1132;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = uVar1154 >> 0x34 | SUB168(auVar508 * auVar966,8) << 0xc;
    auVar4 = auVar510 * auVar967 + auVar1114 + auVar511 * auVar968 + auVar512 * auVar969 +
             auVar513 * auVar970 + auVar514 * auVar971 + auVar515 * ZEXT816(0x1000003d10);
    uVar1154 = auVar4._0_8_;
    auVar1116._8_8_ = 0;
    auVar1116._0_8_ = uVar1154 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = local_1178;
    auVar972._8_8_ = 0;
    auVar972._0_8_ = uVar1132;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uStack_1170;
    auVar973._8_8_ = 0;
    auVar973._0_8_ = uVar1152;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = local_1168;
    auVar974._8_8_ = 0;
    auVar974._0_8_ = uVar1131;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = uStack_1160;
    auVar975._8_8_ = 0;
    auVar975._0_8_ = uVar1128;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = local_1158;
    auVar976._8_8_ = 0;
    auVar976._0_8_ = uVar1153;
    auVar4 = auVar517 * auVar973 + auVar1116 + auVar518 * auVar974 + auVar519 * auVar975 +
             auVar520 * auVar976;
    uVar1139 = auVar4._0_8_;
    auVar1118._8_8_ = 0;
    auVar1118._0_8_ = uVar1139 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar977._8_8_ = 0;
    auVar977._0_8_ = (uVar1139 & 0xfffffffffffff) << 4 | (uVar1154 & 0xfffffffffffff) >> 0x30;
    uVar1139 = auVar1115._0_8_;
    auVar1115 = auVar516 * auVar972 + ZEXT816(0x1000003d1) * auVar977;
    (r->z).n[0] = uVar1139 & 0xfffffffffffff;
    auVar1117._8_8_ = 0;
    auVar1117._0_8_ = uVar1139 >> 0x34 | auVar1115._8_8_ << 0xc;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = local_1178;
    auVar978._8_8_ = 0;
    auVar978._0_8_ = uVar1153;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = uStack_1170;
    auVar979._8_8_ = 0;
    auVar979._0_8_ = uVar1132;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = local_1168;
    auVar980._8_8_ = 0;
    auVar980._0_8_ = uVar1152;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = uStack_1160;
    auVar981._8_8_ = 0;
    auVar981._0_8_ = uVar1131;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = local_1158;
    auVar982._8_8_ = 0;
    auVar982._0_8_ = uVar1128;
    auVar5 = auVar523 * auVar980 + auVar1118 + auVar524 * auVar981 + auVar525 * auVar982;
    uVar1139 = auVar5._0_8_;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uVar1139 & 0xfffffffffffff;
    auVar4 = auVar521 * auVar978 + auVar1117 + auVar522 * auVar979 +
             auVar526 * ZEXT816(0x1000003d10);
    uVar1163 = auVar4._0_8_;
    auVar1120._8_8_ = 0;
    auVar1120._0_8_ = uVar1139 >> 0x34 | auVar5._8_8_ << 0xc;
    (r->z).n[1] = uVar1163 & 0xfffffffffffff;
    auVar1119._8_8_ = 0;
    auVar1119._0_8_ = uVar1163 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = local_1178;
    auVar983._8_8_ = 0;
    auVar983._0_8_ = uVar1128;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = uStack_1170;
    auVar984._8_8_ = 0;
    auVar984._0_8_ = uVar1153;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = local_1168;
    auVar985._8_8_ = 0;
    auVar985._0_8_ = uVar1132;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = uStack_1160;
    auVar986._8_8_ = 0;
    auVar986._0_8_ = uVar1152;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = local_1158;
    auVar987._8_8_ = 0;
    auVar987._0_8_ = uVar1131;
    auVar5 = auVar530 * auVar986 + auVar1120 + auVar531 * auVar987;
    uVar1132 = auVar5._0_8_;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = uVar1132 & 0xfffffffffffff;
    auVar4 = auVar527 * auVar983 + auVar1119 + auVar528 * auVar984 + auVar529 * auVar985 +
             auVar532 * ZEXT816(0x1000003d10);
    uVar1153 = auVar4._0_8_;
    (r->z).n[2] = uVar1153 & 0xfffffffffffff;
    auVar1121._8_8_ = 0;
    auVar1121._0_8_ = (uVar1153 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar1138 & 0xfffffffffffff);
    auVar533._8_8_ = 0;
    auVar533._0_8_ = uVar1132 >> 0x34 | auVar5._8_8_ << 0xc;
    auVar1121 = auVar533 * ZEXT816(0x1000003d10) + auVar1121;
    uVar1132 = auVar1121._0_8_;
    (r->z).n[3] = uVar1132 & 0xfffffffffffff;
    (r->z).n[4] = (uVar1132 >> 0x34 | auVar1121._8_8_ << 0xc) + (uVar1154 & 0xffffffffffff);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
#endif
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
#ifdef USE_ENDOMORPHISM
    state.pre_a_lam = pre_a_lam;
#endif
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}